

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  BBox1f BVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  bool bVar26;
  LinearSpace3fa *pLVar27;
  byte bVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong uVar34;
  bool bVar35;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar73 [16];
  undefined1 auVar107 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  float t1;
  undefined4 uVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  vfloat4 b0;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  vfloat4 b0_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  vfloat4 a0_3;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  vfloat4 a0_2;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar182 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar213;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  vfloat4 a0;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  vfloat4 a0_1;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_378 [16];
  LinearSpace3fa *local_368;
  ulong local_360;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  
  uVar36 = (ulong)(byte)prim[1];
  fVar197 = *(float *)(prim + uVar36 * 0x19 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar41 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar82 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar44 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + uVar36 * 0x19 + 6));
  fVar138 = fVar197 * auVar44._0_4_;
  fVar123 = fVar197 * auVar82._0_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar36 * 4 + 6);
  auVar95 = vpmovsxbd_avx2(auVar12);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar36 * 5 + 6);
  auVar92 = vpmovsxbd_avx2(auVar41);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar36 * 6 + 6);
  auVar93 = vpmovsxbd_avx2(auVar53);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar36 * 0xb + 6);
  auVar106 = vpmovsxbd_avx2(auVar5);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar36 * 0xc + 6);
  auVar96 = vpmovsxbd_avx2(auVar52);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar36 * 0xd + 6);
  auVar94 = vpmovsxbd_avx2(auVar51);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar36 * 0x12 + 6);
  auVar107 = vpmovsxbd_avx2(auVar50);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar36 * 0x13 + 6);
  auVar99 = vpmovsxbd_avx2(auVar54);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar97 = vcvtdq2ps_avx(auVar99);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar36 * 0x14 + 6);
  auVar90 = vpmovsxbd_avx2(auVar49);
  auVar98 = vcvtdq2ps_avx(auVar90);
  auVar109._4_4_ = fVar123;
  auVar109._0_4_ = fVar123;
  auVar109._8_4_ = fVar123;
  auVar109._12_4_ = fVar123;
  auVar109._16_4_ = fVar123;
  auVar109._20_4_ = fVar123;
  auVar109._24_4_ = fVar123;
  auVar109._28_4_ = fVar123;
  auVar151._8_4_ = 1;
  auVar151._0_8_ = 0x100000001;
  auVar151._12_4_ = 1;
  auVar151._16_4_ = 1;
  auVar151._20_4_ = 1;
  auVar151._24_4_ = 1;
  auVar151._28_4_ = 1;
  auVar100 = ZEXT1632(CONCAT412(fVar197 * auVar82._12_4_,
                                CONCAT48(fVar197 * auVar82._8_4_,
                                         CONCAT44(fVar197 * auVar82._4_4_,fVar123))));
  auVar91 = vpermps_avx2(auVar151,auVar100);
  auVar88 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar243 = ZEXT3264(auVar88);
  auVar89 = vpermps_avx512vl(auVar88,auVar100);
  fVar123 = auVar89._0_4_;
  fVar199 = auVar89._4_4_;
  auVar100._4_4_ = fVar199 * auVar93._4_4_;
  auVar100._0_4_ = fVar123 * auVar93._0_4_;
  fVar209 = auVar89._8_4_;
  auVar100._8_4_ = fVar209 * auVar93._8_4_;
  fVar211 = auVar89._12_4_;
  auVar100._12_4_ = fVar211 * auVar93._12_4_;
  fVar128 = auVar89._16_4_;
  auVar100._16_4_ = fVar128 * auVar93._16_4_;
  fVar129 = auVar89._20_4_;
  auVar100._20_4_ = fVar129 * auVar93._20_4_;
  fVar130 = auVar89._24_4_;
  auVar100._24_4_ = fVar130 * auVar93._24_4_;
  auVar100._28_4_ = auVar99._28_4_;
  auVar99._4_4_ = auVar94._4_4_ * fVar199;
  auVar99._0_4_ = auVar94._0_4_ * fVar123;
  auVar99._8_4_ = auVar94._8_4_ * fVar209;
  auVar99._12_4_ = auVar94._12_4_ * fVar211;
  auVar99._16_4_ = auVar94._16_4_ * fVar128;
  auVar99._20_4_ = auVar94._20_4_ * fVar129;
  auVar99._24_4_ = auVar94._24_4_ * fVar130;
  auVar99._28_4_ = auVar90._28_4_;
  auVar90._4_4_ = auVar98._4_4_ * fVar199;
  auVar90._0_4_ = auVar98._0_4_ * fVar123;
  auVar90._8_4_ = auVar98._8_4_ * fVar209;
  auVar90._12_4_ = auVar98._12_4_ * fVar211;
  auVar90._16_4_ = auVar98._16_4_ * fVar128;
  auVar90._20_4_ = auVar98._20_4_ * fVar129;
  auVar90._24_4_ = auVar98._24_4_ * fVar130;
  auVar90._28_4_ = auVar89._28_4_;
  auVar12 = vfmadd231ps_fma(auVar100,auVar91,auVar92);
  auVar41 = vfmadd231ps_fma(auVar99,auVar91,auVar96);
  auVar53 = vfmadd231ps_fma(auVar90,auVar97,auVar91);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar109,auVar95);
  auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar109,auVar106);
  auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar107,auVar109);
  auVar110._4_4_ = fVar138;
  auVar110._0_4_ = fVar138;
  auVar110._8_4_ = fVar138;
  auVar110._12_4_ = fVar138;
  auVar110._16_4_ = fVar138;
  auVar110._20_4_ = fVar138;
  auVar110._24_4_ = fVar138;
  auVar110._28_4_ = fVar138;
  auVar90 = ZEXT1632(CONCAT412(fVar197 * auVar44._12_4_,
                               CONCAT48(fVar197 * auVar44._8_4_,
                                        CONCAT44(fVar197 * auVar44._4_4_,fVar138))));
  auVar99 = vpermps_avx2(auVar151,auVar90);
  auVar90 = vpermps_avx512vl(auVar88,auVar90);
  auVar91 = vmulps_avx512vl(auVar90,auVar93);
  auVar102._0_4_ = auVar90._0_4_ * auVar94._0_4_;
  auVar102._4_4_ = auVar90._4_4_ * auVar94._4_4_;
  auVar102._8_4_ = auVar90._8_4_ * auVar94._8_4_;
  auVar102._12_4_ = auVar90._12_4_ * auVar94._12_4_;
  auVar102._16_4_ = auVar90._16_4_ * auVar94._16_4_;
  auVar102._20_4_ = auVar90._20_4_ * auVar94._20_4_;
  auVar102._24_4_ = auVar90._24_4_ * auVar94._24_4_;
  auVar102._28_4_ = 0;
  auVar94._4_4_ = auVar90._4_4_ * auVar98._4_4_;
  auVar94._0_4_ = auVar90._0_4_ * auVar98._0_4_;
  auVar94._8_4_ = auVar90._8_4_ * auVar98._8_4_;
  auVar94._12_4_ = auVar90._12_4_ * auVar98._12_4_;
  auVar94._16_4_ = auVar90._16_4_ * auVar98._16_4_;
  auVar94._20_4_ = auVar90._20_4_ * auVar98._20_4_;
  auVar94._24_4_ = auVar90._24_4_ * auVar98._24_4_;
  auVar94._28_4_ = auVar93._28_4_;
  auVar92 = vfmadd231ps_avx512vl(auVar91,auVar99,auVar92);
  auVar5 = vfmadd231ps_fma(auVar102,auVar99,auVar96);
  auVar52 = vfmadd231ps_fma(auVar94,auVar99,auVar97);
  auVar92 = vfmadd231ps_avx512vl(auVar92,auVar110,auVar95);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar110,auVar106);
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar110,auVar107);
  auVar104._8_4_ = 0x7fffffff;
  auVar104._0_8_ = 0x7fffffff7fffffff;
  auVar104._12_4_ = 0x7fffffff;
  auVar104._16_4_ = 0x7fffffff;
  auVar104._20_4_ = 0x7fffffff;
  auVar104._24_4_ = 0x7fffffff;
  auVar104._28_4_ = 0x7fffffff;
  auVar95 = vandps_avx(ZEXT1632(auVar12),auVar104);
  auVar108._8_4_ = 0x219392ef;
  auVar108._0_8_ = 0x219392ef219392ef;
  auVar108._12_4_ = 0x219392ef;
  auVar108._16_4_ = 0x219392ef;
  auVar108._20_4_ = 0x219392ef;
  auVar108._24_4_ = 0x219392ef;
  auVar108._28_4_ = 0x219392ef;
  uVar33 = vcmpps_avx512vl(auVar95,auVar108,1);
  bVar35 = (bool)((byte)uVar33 & 1);
  auVar91._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar12._0_4_;
  bVar35 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar12._4_4_;
  bVar35 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar12._8_4_;
  bVar35 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar12._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar41),auVar104);
  uVar33 = vcmpps_avx512vl(auVar95,auVar108,1);
  bVar35 = (bool)((byte)uVar33 & 1);
  auVar88._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar41._0_4_;
  bVar35 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar41._4_4_;
  bVar35 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar41._8_4_;
  bVar35 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar41._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar53),auVar104);
  uVar33 = vcmpps_avx512vl(auVar95,auVar108,1);
  bVar35 = (bool)((byte)uVar33 & 1);
  auVar95._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar53._0_4_;
  bVar35 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar53._4_4_;
  bVar35 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar53._8_4_;
  bVar35 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar53._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar93 = vrcp14ps_avx512vl(auVar91);
  auVar105._8_4_ = 0x3f800000;
  auVar105._0_8_ = 0x3f8000003f800000;
  auVar105._12_4_ = 0x3f800000;
  auVar105._16_4_ = 0x3f800000;
  auVar105._20_4_ = 0x3f800000;
  auVar105._24_4_ = 0x3f800000;
  auVar105._28_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar91,auVar93,auVar105);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar88);
  auVar41 = vfnmadd213ps_fma(auVar88,auVar93,auVar105);
  auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar95);
  auVar53 = vfnmadd213ps_fma(auVar95,auVar93,auVar105);
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 * 7 + 6));
  auVar53 = vfmadd132ps_fma(ZEXT1632(auVar53),auVar93,auVar93);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar93 = vsubps_avx512vl(auVar95,auVar92);
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 * 9 + 6));
  auVar107._4_4_ = auVar12._4_4_ * auVar93._4_4_;
  auVar107._0_4_ = auVar12._0_4_ * auVar93._0_4_;
  auVar107._8_4_ = auVar12._8_4_ * auVar93._8_4_;
  auVar107._12_4_ = auVar12._12_4_ * auVar93._12_4_;
  auVar107._16_4_ = auVar93._16_4_ * 0.0;
  auVar107._20_4_ = auVar93._20_4_ * 0.0;
  auVar107._24_4_ = auVar93._24_4_ * 0.0;
  auVar107._28_4_ = auVar93._28_4_;
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar92 = vsubps_avx512vl(auVar95,auVar92);
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 * 0xe + 6));
  auVar103._0_4_ = auVar12._0_4_ * auVar92._0_4_;
  auVar103._4_4_ = auVar12._4_4_ * auVar92._4_4_;
  auVar103._8_4_ = auVar12._8_4_ * auVar92._8_4_;
  auVar103._12_4_ = auVar12._12_4_ * auVar92._12_4_;
  auVar103._16_4_ = auVar92._16_4_ * 0.0;
  auVar103._20_4_ = auVar92._20_4_ * 0.0;
  auVar103._24_4_ = auVar92._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar5));
  auVar97._4_4_ = auVar41._4_4_ * auVar95._4_4_;
  auVar97._0_4_ = auVar41._0_4_ * auVar95._0_4_;
  auVar97._8_4_ = auVar41._8_4_ * auVar95._8_4_;
  auVar97._12_4_ = auVar41._12_4_ * auVar95._12_4_;
  auVar97._16_4_ = auVar95._16_4_ * 0.0;
  auVar97._20_4_ = auVar95._20_4_ * 0.0;
  auVar97._24_4_ = auVar95._24_4_ * 0.0;
  auVar97._28_4_ = auVar95._28_4_;
  auVar94 = vpbroadcastd_avx512vl();
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar5));
  auVar101._0_4_ = auVar41._0_4_ * auVar95._0_4_;
  auVar101._4_4_ = auVar41._4_4_ * auVar95._4_4_;
  auVar101._8_4_ = auVar41._8_4_ * auVar95._8_4_;
  auVar101._12_4_ = auVar41._12_4_ * auVar95._12_4_;
  auVar101._16_4_ = auVar95._16_4_ * 0.0;
  auVar101._20_4_ = auVar95._20_4_ * 0.0;
  auVar101._24_4_ = auVar95._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 * 0x15 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar52));
  auVar98._4_4_ = auVar95._4_4_ * auVar53._4_4_;
  auVar98._0_4_ = auVar95._0_4_ * auVar53._0_4_;
  auVar98._8_4_ = auVar95._8_4_ * auVar53._8_4_;
  auVar98._12_4_ = auVar95._12_4_ * auVar53._12_4_;
  auVar98._16_4_ = auVar95._16_4_ * 0.0;
  auVar98._20_4_ = auVar95._20_4_ * 0.0;
  auVar98._24_4_ = auVar95._24_4_ * 0.0;
  auVar98._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 * 0x17 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar52));
  auVar89._0_4_ = auVar53._0_4_ * auVar95._0_4_;
  auVar89._4_4_ = auVar53._4_4_ * auVar95._4_4_;
  auVar89._8_4_ = auVar53._8_4_ * auVar95._8_4_;
  auVar89._12_4_ = auVar53._12_4_ * auVar95._12_4_;
  auVar89._16_4_ = auVar95._16_4_ * 0.0;
  auVar89._20_4_ = auVar95._20_4_ * 0.0;
  auVar89._24_4_ = auVar95._24_4_ * 0.0;
  auVar89._28_4_ = 0;
  auVar95 = vpminsd_avx2(auVar107,auVar103);
  auVar92 = vpminsd_avx2(auVar97,auVar101);
  auVar95 = vmaxps_avx(auVar95,auVar92);
  auVar92 = vpminsd_avx2(auVar98,auVar89);
  uVar131 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar93._4_4_ = uVar131;
  auVar93._0_4_ = uVar131;
  auVar93._8_4_ = uVar131;
  auVar93._12_4_ = uVar131;
  auVar93._16_4_ = uVar131;
  auVar93._20_4_ = uVar131;
  auVar93._24_4_ = uVar131;
  auVar93._28_4_ = uVar131;
  auVar92 = vmaxps_avx512vl(auVar92,auVar93);
  auVar95 = vmaxps_avx(auVar95,auVar92);
  auVar92._8_4_ = 0x3f7ffffa;
  auVar92._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar92._12_4_ = 0x3f7ffffa;
  auVar92._16_4_ = 0x3f7ffffa;
  auVar92._20_4_ = 0x3f7ffffa;
  auVar92._24_4_ = 0x3f7ffffa;
  auVar92._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar95,auVar92);
  auVar95 = vpmaxsd_avx2(auVar107,auVar103);
  auVar92 = vpmaxsd_avx2(auVar97,auVar101);
  auVar95 = vminps_avx(auVar95,auVar92);
  auVar92 = vpmaxsd_avx2(auVar98,auVar89);
  uVar131 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar106._4_4_ = uVar131;
  auVar106._0_4_ = uVar131;
  auVar106._8_4_ = uVar131;
  auVar106._12_4_ = uVar131;
  auVar106._16_4_ = uVar131;
  auVar106._20_4_ = uVar131;
  auVar106._24_4_ = uVar131;
  auVar106._28_4_ = uVar131;
  auVar92 = vminps_avx512vl(auVar92,auVar106);
  auVar95 = vminps_avx(auVar95,auVar92);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar96._16_4_ = 0x3f800003;
  auVar96._20_4_ = 0x3f800003;
  auVar96._24_4_ = 0x3f800003;
  auVar96._28_4_ = 0x3f800003;
  auVar95 = vmulps_avx512vl(auVar95,auVar96);
  uVar13 = vcmpps_avx512vl(local_78,auVar95,2);
  uVar14 = vpcmpgtd_avx512vl(auVar94,_DAT_01fb4ba0);
  local_360 = (ulong)(byte)((byte)uVar13 & (byte)uVar14);
  local_368 = pre->ray_space + k;
  auVar12 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar236 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar237 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar238 = ZEXT1664(auVar41);
  auVar245 = ZEXT464(0x3f800000);
  auVar41 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar244 = ZEXT1664(auVar41);
LAB_01a636ae:
  pLVar27 = local_368;
  if (local_360 == 0) {
LAB_01a6524e:
    return local_360 != 0;
  }
  lVar30 = 0;
  for (uVar33 = local_360; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
    lVar30 = lVar30 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  uVar33 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar30 * 4 + 6));
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar41 = *(undefined1 (*) [16])(_Var11 + uVar33 * (long)pvVar10);
  auVar53 = *(undefined1 (*) [16])(_Var11 + (uVar33 + 1) * (long)pvVar10);
  auVar5 = *(undefined1 (*) [16])(_Var11 + (uVar33 + 2) * (long)pvVar10);
  auVar52 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar33 + 3));
  lVar30 = *(long *)&pGVar8[1].time_range.upper;
  auVar51 = *(undefined1 (*) [16])(lVar30 + (long)p_Var9 * uVar33);
  auVar50 = *(undefined1 (*) [16])(lVar30 + (long)p_Var9 * (uVar33 + 1));
  auVar54 = *(undefined1 (*) [16])(lVar30 + (long)p_Var9 * (uVar33 + 2));
  uVar36 = local_360 - 1 & local_360;
  auVar49 = *(undefined1 (*) [16])(lVar30 + (long)p_Var9 * (uVar33 + 3));
  if (uVar36 != 0) {
    uVar34 = uVar36 - 1 & uVar36;
    for (uVar33 = uVar36; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
    }
    if (uVar34 != 0) {
      for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar75 = auVar236._0_16_;
  auVar42 = vmulps_avx512vl(auVar49,auVar75);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar54,auVar42);
  auVar45._0_4_ = auVar50._0_4_ + auVar44._0_4_;
  auVar45._4_4_ = auVar50._4_4_ + auVar44._4_4_;
  auVar45._8_4_ = auVar50._8_4_ + auVar44._8_4_;
  auVar45._12_4_ = auVar50._12_4_ + auVar44._12_4_;
  auVar43 = vfmadd231ps_avx512vl(auVar45,auVar51,auVar75);
  auVar65 = ZEXT816(0) << 0x40;
  auVar47._0_4_ = auVar49._0_4_ * 0.0;
  auVar47._4_4_ = auVar49._4_4_ * 0.0;
  auVar47._8_4_ = auVar49._8_4_ * 0.0;
  auVar47._12_4_ = auVar49._12_4_ * 0.0;
  auVar66 = auVar237._0_16_;
  auVar44 = vfmadd231ps_avx512vl(auVar47,auVar54,auVar66);
  auVar44 = vfmadd231ps_fma(auVar44,auVar50,auVar65);
  auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar51,auVar66);
  auVar46 = vmulps_avx512vl(auVar52,auVar75);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar5,auVar46);
  auVar80._0_4_ = auVar44._0_4_ + auVar53._0_4_;
  auVar80._4_4_ = auVar44._4_4_ + auVar53._4_4_;
  auVar80._8_4_ = auVar44._8_4_ + auVar53._8_4_;
  auVar80._12_4_ = auVar44._12_4_ + auVar53._12_4_;
  auVar47 = vfmadd231ps_avx512vl(auVar80,auVar41,auVar75);
  auVar227._0_4_ = auVar52._0_4_ * 0.0;
  auVar227._4_4_ = auVar52._4_4_ * 0.0;
  auVar227._8_4_ = auVar52._8_4_ * 0.0;
  auVar227._12_4_ = auVar52._12_4_ * 0.0;
  auVar44 = vfmadd231ps_avx512vl(auVar227,auVar5,auVar66);
  auVar44 = vfmadd231ps_fma(auVar44,auVar53,auVar65);
  auVar48 = vfnmadd231ps_avx512vl(auVar44,auVar41,auVar66);
  auVar139._0_4_ = auVar54._0_4_ + auVar42._0_4_;
  auVar139._4_4_ = auVar54._4_4_ + auVar42._4_4_;
  auVar139._8_4_ = auVar54._8_4_ + auVar42._8_4_;
  auVar139._12_4_ = auVar54._12_4_ + auVar42._12_4_;
  auVar44 = vfmadd231ps_fma(auVar139,auVar50,auVar65);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar51,auVar75);
  auVar49 = vmulps_avx512vl(auVar49,auVar66);
  auVar54 = vfmadd231ps_fma(auVar49,auVar65,auVar54);
  auVar50 = vfnmadd231ps_avx512vl(auVar54,auVar66,auVar50);
  auVar49 = vfmadd231ps_fma(auVar50,auVar65,auVar51);
  auVar71._0_4_ = auVar46._0_4_ + auVar5._0_4_;
  auVar71._4_4_ = auVar46._4_4_ + auVar5._4_4_;
  auVar71._8_4_ = auVar46._8_4_ + auVar5._8_4_;
  auVar71._12_4_ = auVar46._12_4_ + auVar5._12_4_;
  auVar51 = vfmadd231ps_fma(auVar71,auVar53,auVar65);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar41,auVar75);
  auVar52 = vmulps_avx512vl(auVar52,auVar66);
  auVar5 = vfmadd231ps_fma(auVar52,auVar65,auVar5);
  auVar53 = vfnmadd231ps_avx512vl(auVar5,auVar66,auVar53);
  auVar50 = vfmadd231ps_fma(auVar53,auVar65,auVar41);
  auVar41 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar53 = vshufps_avx(auVar47,auVar47,0xc9);
  fVar211 = auVar45._0_4_;
  auVar57._0_4_ = fVar211 * auVar53._0_4_;
  fVar128 = auVar45._4_4_;
  auVar57._4_4_ = fVar128 * auVar53._4_4_;
  fVar129 = auVar45._8_4_;
  auVar57._8_4_ = fVar129 * auVar53._8_4_;
  fVar130 = auVar45._12_4_;
  auVar57._12_4_ = fVar130 * auVar53._12_4_;
  auVar53 = vfmsub231ps_fma(auVar57,auVar41,auVar47);
  auVar5 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar58._0_4_ = fVar211 * auVar53._0_4_;
  auVar58._4_4_ = fVar128 * auVar53._4_4_;
  auVar58._8_4_ = fVar129 * auVar53._8_4_;
  auVar58._12_4_ = fVar130 * auVar53._12_4_;
  auVar41 = vfmsub231ps_fma(auVar58,auVar41,auVar48);
  auVar52 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar53 = vshufps_avx(auVar51,auVar51,0xc9);
  fVar138 = auVar49._0_4_;
  auVar55._0_4_ = fVar138 * auVar53._0_4_;
  fVar153 = auVar49._4_4_;
  auVar55._4_4_ = fVar153 * auVar53._4_4_;
  fVar154 = auVar49._8_4_;
  auVar55._8_4_ = fVar154 * auVar53._8_4_;
  fVar155 = auVar49._12_4_;
  auVar55._12_4_ = fVar155 * auVar53._12_4_;
  auVar53 = vfmsub231ps_fma(auVar55,auVar41,auVar51);
  auVar51 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar72._0_4_ = auVar53._0_4_ * fVar138;
  auVar72._4_4_ = auVar53._4_4_ * fVar153;
  auVar72._8_4_ = auVar53._8_4_ * fVar154;
  auVar72._12_4_ = auVar53._12_4_ * fVar155;
  auVar41 = vfmsub231ps_fma(auVar72,auVar41,auVar50);
  auVar50 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vdpps_avx(auVar5,auVar5,0x7f);
  fVar123 = auVar41._0_4_;
  auVar84._4_12_ = ZEXT812(0) << 0x20;
  auVar84._0_4_ = fVar123;
  auVar53 = vrsqrt14ss_avx512f(auVar65,auVar84);
  auVar54 = vmulss_avx512f(auVar53,ZEXT416(0x3fc00000));
  auVar42 = vmulss_avx512f(auVar41,ZEXT416(0xbf000000));
  fVar197 = auVar53._0_4_;
  fVar197 = auVar54._0_4_ + auVar42._0_4_ * fVar197 * fVar197 * fVar197;
  fVar213 = fVar197 * auVar5._0_4_;
  fVar221 = fVar197 * auVar5._4_4_;
  fVar222 = fVar197 * auVar5._8_4_;
  fVar223 = fVar197 * auVar5._12_4_;
  auVar53 = vdpps_avx(auVar5,auVar52,0x7f);
  auVar77._0_4_ = auVar52._0_4_ * fVar123;
  auVar77._4_4_ = auVar52._4_4_ * fVar123;
  auVar77._8_4_ = auVar52._8_4_ * fVar123;
  auVar77._12_4_ = auVar52._12_4_ * fVar123;
  fVar123 = auVar53._0_4_;
  auVar63._0_4_ = fVar123 * auVar5._0_4_;
  auVar63._4_4_ = fVar123 * auVar5._4_4_;
  auVar63._8_4_ = fVar123 * auVar5._8_4_;
  auVar63._12_4_ = fVar123 * auVar5._12_4_;
  auVar5 = vsubps_avx(auVar77,auVar63);
  auVar53 = vrcp14ss_avx512f(auVar65,auVar84);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar53,ZEXT416(0x40000000));
  fVar199 = auVar53._0_4_ * auVar41._0_4_;
  auVar41 = vdpps_avx(auVar51,auVar51,0x7f);
  fVar209 = auVar41._0_4_;
  auVar174._4_12_ = ZEXT812(0) << 0x20;
  auVar174._0_4_ = fVar209;
  auVar53 = vrsqrt14ss_avx512f(auVar65,auVar174);
  auVar52 = vmulss_avx512f(auVar53,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar41,ZEXT416(0xbf000000));
  fVar123 = auVar53._0_4_;
  fVar123 = auVar52._0_4_ + auVar54._0_4_ * fVar123 * fVar123 * fVar123;
  fVar198 = fVar123 * auVar51._0_4_;
  fVar208 = fVar123 * auVar51._4_4_;
  fVar210 = fVar123 * auVar51._8_4_;
  fVar212 = fVar123 * auVar51._12_4_;
  auVar53 = vdpps_avx(auVar51,auVar50,0x7f);
  auVar59._0_4_ = fVar209 * auVar50._0_4_;
  auVar59._4_4_ = fVar209 * auVar50._4_4_;
  auVar59._8_4_ = fVar209 * auVar50._8_4_;
  auVar59._12_4_ = fVar209 * auVar50._12_4_;
  fVar209 = auVar53._0_4_;
  auVar56._0_4_ = fVar209 * auVar51._0_4_;
  auVar56._4_4_ = fVar209 * auVar51._4_4_;
  auVar56._8_4_ = fVar209 * auVar51._8_4_;
  auVar56._12_4_ = fVar209 * auVar51._12_4_;
  auVar52 = vsubps_avx(auVar59,auVar56);
  auVar53 = vrcp14ss_avx512f(auVar65,auVar174);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar53,ZEXT416(0x40000000));
  fVar209 = auVar41._0_4_ * auVar53._0_4_;
  auVar41 = vshufps_avx(auVar43,auVar43,0xff);
  auVar73._0_4_ = fVar213 * auVar41._0_4_;
  auVar73._4_4_ = fVar221 * auVar41._4_4_;
  auVar73._8_4_ = fVar222 * auVar41._8_4_;
  auVar73._12_4_ = fVar223 * auVar41._12_4_;
  auVar50 = vsubps_avx(auVar43,auVar73);
  auVar53 = vshufps_avx(auVar45,auVar45,0xff);
  auVar60._0_4_ = auVar53._0_4_ * fVar213 + auVar41._0_4_ * fVar197 * fVar199 * auVar5._0_4_;
  auVar60._4_4_ = auVar53._4_4_ * fVar221 + auVar41._4_4_ * fVar197 * fVar199 * auVar5._4_4_;
  auVar60._8_4_ = auVar53._8_4_ * fVar222 + auVar41._8_4_ * fVar197 * fVar199 * auVar5._8_4_;
  auVar60._12_4_ = auVar53._12_4_ * fVar223 + auVar41._12_4_ * fVar197 * fVar199 * auVar5._12_4_;
  auVar5 = vsubps_avx(auVar45,auVar60);
  auVar228._0_4_ = auVar73._0_4_ + auVar43._0_4_;
  auVar228._4_4_ = auVar73._4_4_ + auVar43._4_4_;
  auVar228._8_4_ = auVar73._8_4_ + auVar43._8_4_;
  auVar228._12_4_ = auVar73._12_4_ + auVar43._12_4_;
  auVar41 = vshufps_avx(auVar44,auVar44,0xff);
  auVar61._0_4_ = fVar198 * auVar41._0_4_;
  auVar61._4_4_ = fVar208 * auVar41._4_4_;
  auVar61._8_4_ = fVar210 * auVar41._8_4_;
  auVar61._12_4_ = fVar212 * auVar41._12_4_;
  auVar54 = vsubps_avx(auVar44,auVar61);
  auVar53 = vshufps_avx(auVar49,auVar49,0xff);
  auVar48._0_4_ = auVar53._0_4_ * fVar198 + auVar41._0_4_ * fVar123 * auVar52._0_4_ * fVar209;
  auVar48._4_4_ = auVar53._4_4_ * fVar208 + auVar41._4_4_ * fVar123 * auVar52._4_4_ * fVar209;
  auVar48._8_4_ = auVar53._8_4_ * fVar210 + auVar41._8_4_ * fVar123 * auVar52._8_4_ * fVar209;
  auVar48._12_4_ = auVar53._12_4_ * fVar212 + auVar41._12_4_ * fVar123 * auVar52._12_4_ * fVar209;
  auVar41 = vsubps_avx(auVar49,auVar48);
  auVar55 = vaddps_avx512vl(auVar44,auVar61);
  auVar140._0_4_ = auVar5._0_4_ * 0.33333334;
  auVar140._4_4_ = auVar5._4_4_ * 0.33333334;
  auVar140._8_4_ = auVar5._8_4_ * 0.33333334;
  auVar140._12_4_ = auVar5._12_4_ * 0.33333334;
  auVar56 = vaddps_avx512vl(auVar50,auVar140);
  auVar141._0_4_ = auVar41._0_4_ * 0.33333334;
  auVar141._4_4_ = auVar41._4_4_ * 0.33333334;
  auVar141._8_4_ = auVar41._8_4_ * 0.33333334;
  auVar141._12_4_ = auVar41._12_4_ * 0.33333334;
  auVar57 = vsubps_avx512vl(auVar54,auVar141);
  auVar44._0_4_ = (fVar211 + auVar60._0_4_) * 0.33333334;
  auVar44._4_4_ = (fVar128 + auVar60._4_4_) * 0.33333334;
  auVar44._8_4_ = (fVar129 + auVar60._8_4_) * 0.33333334;
  auVar44._12_4_ = (fVar130 + auVar60._12_4_) * 0.33333334;
  auVar58 = vaddps_avx512vl(auVar228,auVar44);
  auVar42._0_4_ = (fVar138 + auVar48._0_4_) * 0.33333334;
  auVar42._4_4_ = (fVar153 + auVar48._4_4_) * 0.33333334;
  auVar42._8_4_ = (fVar154 + auVar48._8_4_) * 0.33333334;
  auVar42._12_4_ = (fVar155 + auVar48._12_4_) * 0.33333334;
  auVar59 = vsubps_avx512vl(auVar55,auVar42);
  auVar49 = vsubps_avx(auVar50,auVar82);
  uVar131 = auVar49._0_4_;
  auVar65._4_4_ = uVar131;
  auVar65._0_4_ = uVar131;
  auVar65._8_4_ = uVar131;
  auVar65._12_4_ = uVar131;
  auVar41 = vshufps_avx(auVar49,auVar49,0x55);
  auVar53 = vshufps_avx(auVar49,auVar49,0xaa);
  aVar3 = (local_368->vx).field_0;
  aVar4 = (local_368->vy).field_0;
  fVar197 = (local_368->vz).field_0.m128[0];
  fVar123 = *(float *)((long)&(local_368->vz).field_0 + 4);
  fVar199 = *(float *)((long)&(local_368->vz).field_0 + 8);
  fVar209 = *(float *)((long)&(local_368->vz).field_0 + 0xc);
  auVar46._0_4_ = fVar197 * auVar53._0_4_;
  auVar46._4_4_ = fVar123 * auVar53._4_4_;
  auVar46._8_4_ = fVar199 * auVar53._8_4_;
  auVar46._12_4_ = fVar209 * auVar53._12_4_;
  auVar41 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar4,auVar41);
  auVar47 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar65);
  auVar60 = vsubps_avx512vl(auVar56,auVar82);
  uVar131 = auVar60._0_4_;
  auVar142._4_4_ = uVar131;
  auVar142._0_4_ = uVar131;
  auVar142._8_4_ = uVar131;
  auVar142._12_4_ = uVar131;
  auVar41 = vshufps_avx(auVar60,auVar60,0x55);
  auVar53 = vshufps_avx(auVar60,auVar60,0xaa);
  auVar66._0_4_ = fVar197 * auVar53._0_4_;
  auVar66._4_4_ = fVar123 * auVar53._4_4_;
  auVar66._8_4_ = fVar199 * auVar53._8_4_;
  auVar66._12_4_ = fVar209 * auVar53._12_4_;
  auVar41 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar4,auVar41);
  auVar48 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar142);
  auVar61 = vsubps_avx512vl(auVar57,auVar82);
  uVar131 = auVar61._0_4_;
  auVar64._4_4_ = uVar131;
  auVar64._0_4_ = uVar131;
  auVar64._8_4_ = uVar131;
  auVar64._12_4_ = uVar131;
  auVar41 = vshufps_avx(auVar61,auVar61,0x55);
  auVar53 = vshufps_avx(auVar61,auVar61,0xaa);
  auVar62._0_4_ = fVar197 * auVar53._0_4_;
  auVar62._4_4_ = fVar123 * auVar53._4_4_;
  auVar62._8_4_ = fVar199 * auVar53._8_4_;
  auVar62._12_4_ = fVar209 * auVar53._12_4_;
  auVar41 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar4,auVar41);
  auVar65 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar64);
  auVar44 = vsubps_avx(auVar54,auVar82);
  uVar131 = auVar44._0_4_;
  auVar68._4_4_ = uVar131;
  auVar68._0_4_ = uVar131;
  auVar68._8_4_ = uVar131;
  auVar68._12_4_ = uVar131;
  auVar41 = vshufps_avx(auVar44,auVar44,0x55);
  auVar53 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar87._0_4_ = auVar53._0_4_ * fVar197;
  auVar87._4_4_ = auVar53._4_4_ * fVar123;
  auVar87._8_4_ = auVar53._8_4_ * fVar199;
  auVar87._12_4_ = auVar53._12_4_ * fVar209;
  auVar41 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar4,auVar41);
  auVar66 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar68);
  auVar42 = vsubps_avx(auVar228,auVar82);
  uVar131 = auVar42._0_4_;
  auVar69._4_4_ = uVar131;
  auVar69._0_4_ = uVar131;
  auVar69._8_4_ = uVar131;
  auVar69._12_4_ = uVar131;
  auVar41 = vshufps_avx(auVar42,auVar42,0x55);
  auVar53 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar78._0_4_ = auVar53._0_4_ * fVar197;
  auVar78._4_4_ = auVar53._4_4_ * fVar123;
  auVar78._8_4_ = auVar53._8_4_ * fVar199;
  auVar78._12_4_ = auVar53._12_4_ * fVar209;
  auVar41 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar41);
  auVar139 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar69);
  auVar62 = vsubps_avx512vl(auVar58,auVar82);
  uVar131 = auVar62._0_4_;
  auVar70._4_4_ = uVar131;
  auVar70._0_4_ = uVar131;
  auVar70._8_4_ = uVar131;
  auVar70._12_4_ = uVar131;
  auVar41 = vshufps_avx(auVar62,auVar62,0x55);
  auVar53 = vshufps_avx(auVar62,auVar62,0xaa);
  auVar81._0_4_ = auVar53._0_4_ * fVar197;
  auVar81._4_4_ = auVar53._4_4_ * fVar123;
  auVar81._8_4_ = auVar53._8_4_ * fVar199;
  auVar81._12_4_ = auVar53._12_4_ * fVar209;
  auVar41 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar41);
  auVar140 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar70);
  auVar63 = vsubps_avx512vl(auVar59,auVar82);
  uVar131 = auVar63._0_4_;
  auVar74._4_4_ = uVar131;
  auVar74._0_4_ = uVar131;
  auVar74._8_4_ = uVar131;
  auVar74._12_4_ = uVar131;
  auVar41 = vshufps_avx(auVar63,auVar63,0x55);
  auVar53 = vshufps_avx(auVar63,auVar63,0xaa);
  auVar79._0_4_ = auVar53._0_4_ * fVar197;
  auVar79._4_4_ = auVar53._4_4_ * fVar123;
  auVar79._8_4_ = auVar53._8_4_ * fVar199;
  auVar79._12_4_ = auVar53._12_4_ * fVar209;
  auVar41 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar41);
  auVar141 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar74);
  auVar64 = vsubps_avx512vl(auVar55,auVar82);
  uVar131 = auVar64._0_4_;
  auVar43._4_4_ = uVar131;
  auVar43._0_4_ = uVar131;
  auVar43._8_4_ = uVar131;
  auVar43._12_4_ = uVar131;
  auVar41 = vshufps_avx(auVar64,auVar64,0x55);
  auVar53 = vshufps_avx(auVar64,auVar64,0xaa);
  auVar67._0_4_ = auVar53._0_4_ * fVar197;
  auVar67._4_4_ = auVar53._4_4_ * fVar123;
  auVar67._8_4_ = auVar53._8_4_ * fVar199;
  auVar67._12_4_ = auVar53._12_4_ * fVar209;
  auVar41 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar4,auVar41);
  auVar142 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar43);
  auVar5 = vmovlhps_avx(auVar47,auVar139);
  auVar43 = vmovlhps_avx512f(auVar48,auVar140);
  auVar45 = vmovlhps_avx512f(auVar65,auVar141);
  auVar46 = vmovlhps_avx512f(auVar66,auVar142);
  auVar41 = vminps_avx512vl(auVar5,auVar43);
  auVar52 = vmaxps_avx512vl(auVar5,auVar43);
  auVar53 = vminps_avx512vl(auVar45,auVar46);
  auVar53 = vminps_avx(auVar41,auVar53);
  auVar41 = vmaxps_avx512vl(auVar45,auVar46);
  auVar41 = vmaxps_avx(auVar52,auVar41);
  auVar52 = vshufpd_avx(auVar53,auVar53,3);
  auVar51 = vshufpd_avx(auVar41,auVar41,3);
  auVar53 = vminps_avx(auVar53,auVar52);
  auVar41 = vmaxps_avx(auVar41,auVar51);
  auVar53 = vandps_avx512vl(auVar53,auVar238._0_16_);
  auVar41 = vandps_avx512vl(auVar41,auVar238._0_16_);
  auVar41 = vmaxps_avx(auVar53,auVar41);
  auVar53 = vmovshdup_avx(auVar41);
  auVar41 = vmaxss_avx(auVar53,auVar41);
  fVar197 = auVar41._0_4_ * 9.536743e-07;
  auVar168._8_8_ = auVar47._0_8_;
  auVar168._0_8_ = auVar47._0_8_;
  auVar52 = vmovddup_avx512vl(auVar48);
  auVar51 = vmovddup_avx512vl(auVar65);
  auVar182._0_8_ = auVar66._0_8_;
  auVar182._8_8_ = auVar182._0_8_;
  auVar95 = vbroadcastss_avx512vl(ZEXT416((uint)fVar197));
  auVar41 = vxorps_avx512vl(auVar95._0_16_,auVar75);
  auVar92 = vbroadcastss_avx512vl(auVar41);
  auVar47 = vpbroadcastd_avx512vl();
  bVar35 = false;
  uVar33 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0x30);
  auVar48 = vsubps_avx512vl(auVar43,auVar5);
  auVar65 = vsubps_avx512vl(auVar45,auVar43);
  auVar66 = vsubps_avx512vl(auVar46,auVar45);
  auVar41 = vsubps_avx(auVar228,auVar50);
  auVar67 = vsubps_avx512vl(auVar58,auVar56);
  auVar68 = vsubps_avx512vl(auVar59,auVar57);
  auVar69 = vsubps_avx512vl(auVar55,auVar54);
  auVar70 = vpbroadcastd_avx512vl();
  auVar53 = ZEXT816(0x3f80000000000000);
  auVar82 = auVar53;
LAB_01a63e11:
  auVar74 = vshufps_avx(auVar82,auVar82,0x50);
  auVar86._8_4_ = 0x3f800000;
  auVar86._0_8_ = 0x3f8000003f800000;
  auVar86._12_4_ = 0x3f800000;
  auVar231._16_4_ = 0x3f800000;
  auVar231._0_16_ = auVar86;
  auVar231._20_4_ = 0x3f800000;
  auVar231._24_4_ = 0x3f800000;
  auVar231._28_4_ = 0x3f800000;
  auVar174 = vsubps_avx(auVar86,auVar74);
  fVar123 = auVar74._0_4_;
  fVar128 = auVar139._0_4_;
  auVar76._0_4_ = fVar128 * fVar123;
  fVar199 = auVar74._4_4_;
  fVar129 = auVar139._4_4_;
  auVar76._4_4_ = fVar129 * fVar199;
  fVar209 = auVar74._8_4_;
  auVar76._8_4_ = fVar128 * fVar209;
  fVar211 = auVar74._12_4_;
  auVar76._12_4_ = fVar129 * fVar211;
  fVar130 = auVar140._0_4_;
  auVar83._0_4_ = fVar130 * fVar123;
  fVar138 = auVar140._4_4_;
  auVar83._4_4_ = fVar138 * fVar199;
  auVar83._8_4_ = fVar130 * fVar209;
  auVar83._12_4_ = fVar138 * fVar211;
  fVar153 = auVar141._0_4_;
  auVar85._0_4_ = fVar153 * fVar123;
  fVar154 = auVar141._4_4_;
  auVar85._4_4_ = fVar154 * fVar199;
  auVar85._8_4_ = fVar153 * fVar209;
  auVar85._12_4_ = fVar154 * fVar211;
  fVar155 = auVar142._0_4_;
  auVar75._0_4_ = fVar155 * fVar123;
  fVar198 = auVar142._4_4_;
  auVar75._4_4_ = fVar198 * fVar199;
  auVar75._8_4_ = fVar155 * fVar209;
  auVar75._12_4_ = fVar198 * fVar211;
  auVar73 = vfmadd231ps_fma(auVar76,auVar174,auVar168);
  auVar71 = vfmadd231ps_avx512vl(auVar83,auVar174,auVar52);
  auVar72 = vfmadd231ps_avx512vl(auVar85,auVar174,auVar51);
  auVar174 = vfmadd231ps_fma(auVar75,auVar182,auVar174);
  auVar74 = vmovshdup_avx(auVar53);
  fVar199 = auVar53._0_4_;
  fVar123 = (auVar74._0_4_ - fVar199) * 0.04761905;
  auVar181._4_4_ = fVar199;
  auVar181._0_4_ = fVar199;
  auVar181._8_4_ = fVar199;
  auVar181._12_4_ = fVar199;
  auVar181._16_4_ = fVar199;
  auVar181._20_4_ = fVar199;
  auVar181._24_4_ = fVar199;
  auVar181._28_4_ = fVar199;
  auVar147._0_8_ = auVar74._0_8_;
  auVar147._8_8_ = auVar147._0_8_;
  auVar147._16_8_ = auVar147._0_8_;
  auVar147._24_8_ = auVar147._0_8_;
  auVar93 = vsubps_avx(auVar147,auVar181);
  uVar131 = auVar73._0_4_;
  auVar148._4_4_ = uVar131;
  auVar148._0_4_ = uVar131;
  auVar148._8_4_ = uVar131;
  auVar148._12_4_ = uVar131;
  auVar148._16_4_ = uVar131;
  auVar148._20_4_ = uVar131;
  auVar148._24_4_ = uVar131;
  auVar148._28_4_ = uVar131;
  auVar194._8_4_ = 1;
  auVar194._0_8_ = 0x100000001;
  auVar194._12_4_ = 1;
  auVar194._16_4_ = 1;
  auVar194._20_4_ = 1;
  auVar194._24_4_ = 1;
  auVar194._28_4_ = 1;
  auVar94 = ZEXT1632(auVar73);
  auVar106 = vpermps_avx2(auVar194,auVar94);
  auVar96 = vbroadcastss_avx512vl(auVar71);
  auVar107 = ZEXT1632(auVar71);
  auVar97 = vpermps_avx512vl(auVar194,auVar107);
  auVar98 = vbroadcastss_avx512vl(auVar72);
  auVar102 = ZEXT1632(auVar72);
  auVar99 = vpermps_avx512vl(auVar194,auVar102);
  auVar90 = vbroadcastss_avx512vl(auVar174);
  auVar103 = ZEXT1632(auVar174);
  auVar91 = vpermps_avx512vl(auVar194,auVar103);
  auVar195._4_4_ = fVar123;
  auVar195._0_4_ = fVar123;
  auVar195._8_4_ = fVar123;
  auVar195._12_4_ = fVar123;
  auVar195._16_4_ = fVar123;
  auVar195._20_4_ = fVar123;
  auVar195._24_4_ = fVar123;
  auVar195._28_4_ = fVar123;
  auVar104 = auVar243._0_32_;
  auVar100 = vpermps_avx512vl(auVar104,auVar94);
  auVar173._8_4_ = 3;
  auVar173._0_8_ = 0x300000003;
  auVar173._12_4_ = 3;
  auVar173._16_4_ = 3;
  auVar173._20_4_ = 3;
  auVar173._24_4_ = 3;
  auVar173._28_4_ = 3;
  auVar88 = vpermps_avx512vl(auVar173,auVar94);
  auVar89 = vpermps_avx512vl(auVar104,auVar107);
  auVar94 = vpermps_avx2(auVar173,auVar107);
  auVar101 = vpermps_avx512vl(auVar104,auVar102);
  auVar107 = vpermps_avx2(auVar173,auVar102);
  auVar102 = vpermps_avx512vl(auVar104,auVar103);
  auVar103 = vpermps_avx512vl(auVar173,auVar103);
  auVar74 = vfmadd132ps_fma(auVar93,auVar181,_DAT_01f7b040);
  auVar93 = vsubps_avx(auVar231,ZEXT1632(auVar74));
  auVar104 = vmulps_avx512vl(auVar96,ZEXT1632(auVar74));
  auVar108 = ZEXT1632(auVar74);
  auVar105 = vmulps_avx512vl(auVar97,auVar108);
  auVar174 = vfmadd231ps_fma(auVar104,auVar93,auVar148);
  auVar73 = vfmadd231ps_fma(auVar105,auVar93,auVar106);
  auVar104 = vmulps_avx512vl(auVar98,auVar108);
  auVar105 = vmulps_avx512vl(auVar99,auVar108);
  auVar96 = vfmadd231ps_avx512vl(auVar104,auVar93,auVar96);
  auVar97 = vfmadd231ps_avx512vl(auVar105,auVar93,auVar97);
  auVar104 = vmulps_avx512vl(auVar90,auVar108);
  auVar105 = ZEXT1632(auVar74);
  auVar91 = vmulps_avx512vl(auVar91,auVar105);
  auVar98 = vfmadd231ps_avx512vl(auVar104,auVar93,auVar98);
  auVar99 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar99);
  fVar209 = auVar74._0_4_;
  fVar211 = auVar74._4_4_;
  auVar160._4_4_ = fVar211 * auVar96._4_4_;
  auVar160._0_4_ = fVar209 * auVar96._0_4_;
  fVar208 = auVar74._8_4_;
  auVar160._8_4_ = fVar208 * auVar96._8_4_;
  fVar210 = auVar74._12_4_;
  auVar160._12_4_ = fVar210 * auVar96._12_4_;
  auVar160._16_4_ = auVar96._16_4_ * 0.0;
  auVar160._20_4_ = auVar96._20_4_ * 0.0;
  auVar160._24_4_ = auVar96._24_4_ * 0.0;
  auVar160._28_4_ = fVar199;
  auVar21._4_4_ = fVar211 * auVar97._4_4_;
  auVar21._0_4_ = fVar209 * auVar97._0_4_;
  auVar21._8_4_ = fVar208 * auVar97._8_4_;
  auVar21._12_4_ = fVar210 * auVar97._12_4_;
  auVar21._16_4_ = auVar97._16_4_ * 0.0;
  auVar21._20_4_ = auVar97._20_4_ * 0.0;
  auVar21._24_4_ = auVar97._24_4_ * 0.0;
  auVar21._28_4_ = auVar106._28_4_;
  auVar174 = vfmadd231ps_fma(auVar160,auVar93,ZEXT1632(auVar174));
  auVar73 = vfmadd231ps_fma(auVar21,auVar93,ZEXT1632(auVar73));
  auVar136._0_4_ = fVar209 * auVar98._0_4_;
  auVar136._4_4_ = fVar211 * auVar98._4_4_;
  auVar136._8_4_ = fVar208 * auVar98._8_4_;
  auVar136._12_4_ = fVar210 * auVar98._12_4_;
  auVar136._16_4_ = auVar98._16_4_ * 0.0;
  auVar136._20_4_ = auVar98._20_4_ * 0.0;
  auVar136._24_4_ = auVar98._24_4_ * 0.0;
  auVar136._28_4_ = 0;
  auVar22._4_4_ = fVar211 * auVar99._4_4_;
  auVar22._0_4_ = fVar209 * auVar99._0_4_;
  auVar22._8_4_ = fVar208 * auVar99._8_4_;
  auVar22._12_4_ = fVar210 * auVar99._12_4_;
  auVar22._16_4_ = auVar99._16_4_ * 0.0;
  auVar22._20_4_ = auVar99._20_4_ * 0.0;
  auVar22._24_4_ = auVar99._24_4_ * 0.0;
  auVar22._28_4_ = auVar98._28_4_;
  auVar71 = vfmadd231ps_fma(auVar136,auVar93,auVar96);
  auVar72 = vfmadd231ps_fma(auVar22,auVar93,auVar97);
  auVar23._28_4_ = auVar97._28_4_;
  auVar23._0_28_ =
       ZEXT1628(CONCAT412(fVar210 * auVar72._12_4_,
                          CONCAT48(fVar208 * auVar72._8_4_,
                                   CONCAT44(fVar211 * auVar72._4_4_,fVar209 * auVar72._0_4_))));
  auVar84 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar210 * auVar71._12_4_,
                                               CONCAT48(fVar208 * auVar71._8_4_,
                                                        CONCAT44(fVar211 * auVar71._4_4_,
                                                                 fVar209 * auVar71._0_4_)))),auVar93
                            ,ZEXT1632(auVar174));
  auVar87 = vfmadd231ps_fma(auVar23,auVar93,ZEXT1632(auVar73));
  auVar106 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar174));
  auVar96 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar73));
  auVar97 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar106 = vmulps_avx512vl(auVar106,auVar97);
  auVar96 = vmulps_avx512vl(auVar96,auVar97);
  auVar191._0_4_ = fVar123 * auVar106._0_4_;
  auVar191._4_4_ = fVar123 * auVar106._4_4_;
  auVar191._8_4_ = fVar123 * auVar106._8_4_;
  auVar191._12_4_ = fVar123 * auVar106._12_4_;
  auVar191._16_4_ = fVar123 * auVar106._16_4_;
  auVar191._20_4_ = fVar123 * auVar106._20_4_;
  auVar191._24_4_ = fVar123 * auVar106._24_4_;
  auVar191._28_4_ = 0;
  auVar106 = vmulps_avx512vl(auVar195,auVar96);
  auVar73 = vxorps_avx512vl(auVar90._0_16_,auVar90._0_16_);
  auVar96 = vpermt2ps_avx512vl(ZEXT1632(auVar84),_DAT_01fb9fc0,ZEXT1632(auVar73));
  auVar98 = vpermt2ps_avx512vl(ZEXT1632(auVar87),_DAT_01fb9fc0,ZEXT1632(auVar73));
  auVar137._0_4_ = auVar191._0_4_ + auVar84._0_4_;
  auVar137._4_4_ = auVar191._4_4_ + auVar84._4_4_;
  auVar137._8_4_ = auVar191._8_4_ + auVar84._8_4_;
  auVar137._12_4_ = auVar191._12_4_ + auVar84._12_4_;
  auVar137._16_4_ = auVar191._16_4_ + 0.0;
  auVar137._20_4_ = auVar191._20_4_ + 0.0;
  auVar137._24_4_ = auVar191._24_4_ + 0.0;
  auVar137._28_4_ = 0;
  auVar108 = ZEXT1632(auVar73);
  auVar99 = vpermt2ps_avx512vl(auVar191,_DAT_01fb9fc0,auVar108);
  auVar90 = vaddps_avx512vl(ZEXT1632(auVar87),auVar106);
  auVar91 = vpermt2ps_avx512vl(auVar106,_DAT_01fb9fc0,auVar108);
  auVar106 = vsubps_avx(auVar96,auVar99);
  auVar99 = vsubps_avx512vl(auVar98,auVar91);
  auVar91 = vmulps_avx512vl(auVar89,auVar105);
  auVar104 = vmulps_avx512vl(auVar94,auVar105);
  auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar100);
  auVar100 = vfmadd231ps_avx512vl(auVar104,auVar93,auVar88);
  auVar88 = vmulps_avx512vl(auVar101,auVar105);
  auVar104 = vmulps_avx512vl(auVar107,auVar105);
  auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar89);
  auVar94 = vfmadd231ps_avx512vl(auVar104,auVar93,auVar94);
  auVar89 = vmulps_avx512vl(auVar102,auVar105);
  auVar102 = vmulps_avx512vl(auVar103,auVar105);
  auVar174 = vfmadd231ps_fma(auVar89,auVar93,auVar101);
  auVar89 = vfmadd231ps_avx512vl(auVar102,auVar93,auVar107);
  auVar101 = vmulps_avx512vl(auVar105,auVar88);
  auVar103 = ZEXT1632(auVar74);
  auVar102 = vmulps_avx512vl(auVar103,auVar94);
  auVar91 = vfmadd231ps_avx512vl(auVar101,auVar93,auVar91);
  auVar100 = vfmadd231ps_avx512vl(auVar102,auVar93,auVar100);
  auVar89 = vmulps_avx512vl(auVar103,auVar89);
  auVar88 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar210 * auVar174._12_4_,
                                          CONCAT48(fVar208 * auVar174._8_4_,
                                                   CONCAT44(fVar211 * auVar174._4_4_,
                                                            fVar209 * auVar174._0_4_)))),auVar93,
                       auVar88);
  auVar94 = vfmadd231ps_avx512vl(auVar89,auVar93,auVar94);
  auVar24._4_4_ = fVar211 * auVar88._4_4_;
  auVar24._0_4_ = fVar209 * auVar88._0_4_;
  auVar24._8_4_ = fVar208 * auVar88._8_4_;
  auVar24._12_4_ = fVar210 * auVar88._12_4_;
  auVar24._16_4_ = auVar88._16_4_ * 0.0;
  auVar24._20_4_ = auVar88._20_4_ * 0.0;
  auVar24._24_4_ = auVar88._24_4_ * 0.0;
  auVar24._28_4_ = auVar107._28_4_;
  auVar107 = vmulps_avx512vl(auVar103,auVar94);
  auVar89 = vfmadd231ps_avx512vl(auVar24,auVar93,auVar91);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar100,auVar93);
  auVar93 = vsubps_avx512vl(auVar88,auVar91);
  auVar94 = vsubps_avx512vl(auVar94,auVar100);
  auVar93 = vmulps_avx512vl(auVar93,auVar97);
  auVar94 = vmulps_avx512vl(auVar94,auVar97);
  fVar199 = fVar123 * auVar93._0_4_;
  fVar209 = fVar123 * auVar93._4_4_;
  auVar25._4_4_ = fVar209;
  auVar25._0_4_ = fVar199;
  fVar211 = fVar123 * auVar93._8_4_;
  auVar25._8_4_ = fVar211;
  fVar208 = fVar123 * auVar93._12_4_;
  auVar25._12_4_ = fVar208;
  fVar210 = fVar123 * auVar93._16_4_;
  auVar25._16_4_ = fVar210;
  fVar212 = fVar123 * auVar93._20_4_;
  auVar25._20_4_ = fVar212;
  fVar123 = fVar123 * auVar93._24_4_;
  auVar25._24_4_ = fVar123;
  auVar25._28_4_ = auVar93._28_4_;
  auVar94 = vmulps_avx512vl(auVar195,auVar94);
  auVar97 = vpermt2ps_avx512vl(auVar89,_DAT_01fb9fc0,auVar108);
  auVar91 = vpermt2ps_avx512vl(auVar107,_DAT_01fb9fc0,auVar108);
  auVar196._0_4_ = auVar89._0_4_ + fVar199;
  auVar196._4_4_ = auVar89._4_4_ + fVar209;
  auVar196._8_4_ = auVar89._8_4_ + fVar211;
  auVar196._12_4_ = auVar89._12_4_ + fVar208;
  auVar196._16_4_ = auVar89._16_4_ + fVar210;
  auVar196._20_4_ = auVar89._20_4_ + fVar212;
  auVar196._24_4_ = auVar89._24_4_ + fVar123;
  auVar196._28_4_ = auVar89._28_4_ + auVar93._28_4_;
  auVar93 = vpermt2ps_avx512vl(auVar25,_DAT_01fb9fc0,ZEXT1632(auVar73));
  auVar100 = vaddps_avx512vl(auVar107,auVar94);
  auVar94 = vpermt2ps_avx512vl(auVar94,_DAT_01fb9fc0,ZEXT1632(auVar73));
  auVar93 = vsubps_avx(auVar97,auVar93);
  auVar94 = vsubps_avx512vl(auVar91,auVar94);
  auVar151 = ZEXT1632(auVar84);
  auVar88 = vsubps_avx512vl(auVar89,auVar151);
  auVar160 = ZEXT1632(auVar87);
  auVar101 = vsubps_avx512vl(auVar107,auVar160);
  auVar102 = vsubps_avx512vl(auVar97,auVar96);
  auVar88 = vaddps_avx512vl(auVar88,auVar102);
  auVar102 = vsubps_avx512vl(auVar91,auVar98);
  auVar101 = vaddps_avx512vl(auVar101,auVar102);
  auVar102 = vmulps_avx512vl(auVar160,auVar88);
  auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar151,auVar101);
  auVar103 = vmulps_avx512vl(auVar90,auVar88);
  auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar137,auVar101);
  auVar104 = vmulps_avx512vl(auVar99,auVar88);
  auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar106,auVar101);
  auVar105 = vmulps_avx512vl(auVar98,auVar88);
  auVar105 = vfnmadd231ps_avx512vl(auVar105,auVar96,auVar101);
  auVar108 = vmulps_avx512vl(auVar107,auVar88);
  auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar89,auVar101);
  auVar109 = vmulps_avx512vl(auVar100,auVar88);
  auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar196,auVar101);
  auVar110 = vmulps_avx512vl(auVar94,auVar88);
  auVar110 = vfnmadd231ps_avx512vl(auVar110,auVar93,auVar101);
  auVar88 = vmulps_avx512vl(auVar91,auVar88);
  auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar97,auVar101);
  auVar101 = vminps_avx512vl(auVar102,auVar103);
  auVar102 = vmaxps_avx512vl(auVar102,auVar103);
  auVar103 = vminps_avx512vl(auVar104,auVar105);
  auVar101 = vminps_avx512vl(auVar101,auVar103);
  auVar103 = vmaxps_avx512vl(auVar104,auVar105);
  auVar102 = vmaxps_avx512vl(auVar102,auVar103);
  auVar103 = vminps_avx512vl(auVar108,auVar109);
  auVar104 = vmaxps_avx512vl(auVar108,auVar109);
  auVar105 = vminps_avx512vl(auVar110,auVar88);
  auVar103 = vminps_avx512vl(auVar103,auVar105);
  auVar101 = vminps_avx512vl(auVar101,auVar103);
  auVar88 = vmaxps_avx512vl(auVar110,auVar88);
  auVar88 = vmaxps_avx512vl(auVar104,auVar88);
  auVar88 = vmaxps_avx512vl(auVar102,auVar88);
  uVar13 = vcmpps_avx512vl(auVar101,auVar95,2);
  uVar14 = vcmpps_avx512vl(auVar88,auVar92,5);
  bVar28 = (byte)uVar13 & (byte)uVar14 & 0x7f;
  if (bVar28 != 0) {
    auVar88 = vsubps_avx512vl(auVar96,auVar151);
    auVar101 = vsubps_avx512vl(auVar98,auVar160);
    auVar102 = vsubps_avx512vl(auVar97,auVar89);
    auVar88 = vaddps_avx512vl(auVar88,auVar102);
    auVar102 = vsubps_avx512vl(auVar91,auVar107);
    auVar101 = vaddps_avx512vl(auVar101,auVar102);
    auVar102 = vmulps_avx512vl(auVar160,auVar88);
    auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar101,auVar151);
    auVar90 = vmulps_avx512vl(auVar90,auVar88);
    auVar90 = vfnmadd213ps_avx512vl(auVar137,auVar101,auVar90);
    auVar99 = vmulps_avx512vl(auVar99,auVar88);
    auVar99 = vfnmadd213ps_avx512vl(auVar106,auVar101,auVar99);
    auVar106 = vmulps_avx512vl(auVar98,auVar88);
    auVar98 = vfnmadd231ps_avx512vl(auVar106,auVar101,auVar96);
    auVar106 = vmulps_avx512vl(auVar107,auVar88);
    auVar107 = vfnmadd231ps_avx512vl(auVar106,auVar101,auVar89);
    auVar106 = vmulps_avx512vl(auVar100,auVar88);
    auVar100 = vfnmadd213ps_avx512vl(auVar196,auVar101,auVar106);
    auVar106 = vmulps_avx512vl(auVar94,auVar88);
    auVar89 = vfnmadd213ps_avx512vl(auVar93,auVar101,auVar106);
    auVar93 = vmulps_avx512vl(auVar91,auVar88);
    auVar97 = vfnmadd231ps_avx512vl(auVar93,auVar97,auVar101);
    auVar106 = vminps_avx(auVar102,auVar90);
    auVar93 = vmaxps_avx(auVar102,auVar90);
    auVar96 = vminps_avx(auVar99,auVar98);
    auVar96 = vminps_avx(auVar106,auVar96);
    auVar106 = vmaxps_avx(auVar99,auVar98);
    auVar93 = vmaxps_avx(auVar93,auVar106);
    auVar94 = vminps_avx(auVar107,auVar100);
    auVar106 = vmaxps_avx(auVar107,auVar100);
    auVar107 = vminps_avx(auVar89,auVar97);
    auVar94 = vminps_avx(auVar94,auVar107);
    auVar94 = vminps_avx(auVar96,auVar94);
    auVar96 = vmaxps_avx(auVar89,auVar97);
    auVar106 = vmaxps_avx(auVar106,auVar96);
    auVar93 = vmaxps_avx(auVar93,auVar106);
    uVar13 = vcmpps_avx512vl(auVar93,auVar92,5);
    uVar14 = vcmpps_avx512vl(auVar94,auVar95,2);
    bVar28 = bVar28 & (byte)uVar13 & (byte)uVar14;
    if (bVar28 != 0) {
      mask_stack[uVar33] = (uint)bVar28;
      BVar2 = (BBox1f)vmovlps_avx(auVar53);
      cu_stack[uVar33] = BVar2;
      BVar2 = (BBox1f)vmovlps_avx(auVar82);
      cv_stack[uVar33] = BVar2;
      uVar33 = (ulong)((int)uVar33 + 1);
    }
  }
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar236 = ZEXT1664(auVar53);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar237 = ZEXT1664(auVar53);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar238 = ZEXT1664(auVar53);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar239 = ZEXT3264(auVar93);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar240 = ZEXT1664(auVar53);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar241 = ZEXT1664(auVar53);
  auVar242 = ZEXT3264(_DAT_01fb9fe0);
LAB_01a6430c:
  do {
    do {
      do {
        if ((int)uVar33 == 0) {
          if (bVar35) goto LAB_01a6524e;
          uVar131 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar20._4_4_ = uVar131;
          auVar20._0_4_ = uVar131;
          auVar20._8_4_ = uVar131;
          auVar20._12_4_ = uVar131;
          auVar20._16_4_ = uVar131;
          auVar20._20_4_ = uVar131;
          auVar20._24_4_ = uVar131;
          auVar20._28_4_ = uVar131;
          uVar13 = vcmpps_avx512vl(local_78,auVar20,2);
          local_360 = (ulong)((uint)uVar36 & (uint)uVar13);
          goto LAB_01a636ae;
        }
        uVar29 = (int)uVar33 - 1;
        uVar7 = mask_stack[uVar29];
        auVar82._8_8_ = 0;
        auVar82._0_4_ = cv_stack[uVar29].lower;
        auVar82._4_4_ = cv_stack[uVar29].upper;
        uVar34 = 0;
        for (uVar32 = (ulong)uVar7; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
          uVar34 = uVar34 + 1;
        }
        uVar31 = uVar7 - 1 & uVar7;
        bVar39 = uVar31 == 0;
        mask_stack[uVar29] = uVar31;
        if (bVar39) {
          uVar33 = (ulong)uVar29;
        }
        auVar124._8_8_ = 0;
        auVar124._0_8_ = uVar34;
        auVar53 = vpunpcklqdq_avx(auVar124,ZEXT416((int)uVar34 + 1));
        auVar53 = vcvtqq2ps_avx512vl(auVar53);
        auVar53 = vmulps_avx512vl(auVar53,auVar240._0_16_);
        fVar123 = cu_stack[uVar29].upper;
        auVar15._4_4_ = fVar123;
        auVar15._0_4_ = fVar123;
        auVar15._8_4_ = fVar123;
        auVar15._12_4_ = fVar123;
        auVar74 = vmulps_avx512vl(auVar53,auVar15);
        auVar174 = auVar241._0_16_;
        auVar53 = vsubps_avx512vl(auVar174,auVar53);
        fVar123 = cu_stack[uVar29].lower;
        auVar16._4_4_ = fVar123;
        auVar16._0_4_ = fVar123;
        auVar16._8_4_ = fVar123;
        auVar16._12_4_ = fVar123;
        auVar53 = vfmadd231ps_avx512vl(auVar74,auVar53,auVar16);
        auVar74 = vmovshdup_avx(auVar53);
        fVar123 = auVar74._0_4_ - auVar53._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar123));
        if (uVar7 == 0 || bVar39) goto LAB_01a63e11;
        auVar74 = vshufps_avx(auVar82,auVar82,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar123));
        auVar72 = vsubps_avx512vl(auVar174,auVar74);
        fVar199 = auVar74._0_4_;
        auVar156._0_4_ = fVar199 * fVar128;
        fVar209 = auVar74._4_4_;
        auVar156._4_4_ = fVar209 * fVar129;
        fVar211 = auVar74._8_4_;
        auVar156._8_4_ = fVar211 * fVar128;
        fVar208 = auVar74._12_4_;
        auVar156._12_4_ = fVar208 * fVar129;
        auVar163._0_4_ = fVar199 * fVar130;
        auVar163._4_4_ = fVar209 * fVar138;
        auVar163._8_4_ = fVar211 * fVar130;
        auVar163._12_4_ = fVar208 * fVar138;
        auVar169._0_4_ = fVar199 * fVar153;
        auVar169._4_4_ = fVar209 * fVar154;
        auVar169._8_4_ = fVar211 * fVar153;
        auVar169._12_4_ = fVar208 * fVar154;
        auVar143._0_4_ = fVar199 * fVar155;
        auVar143._4_4_ = fVar209 * fVar198;
        auVar143._8_4_ = fVar211 * fVar155;
        auVar143._12_4_ = fVar208 * fVar198;
        auVar74 = vfmadd231ps_fma(auVar156,auVar72,auVar168);
        auVar73 = vfmadd231ps_fma(auVar163,auVar72,auVar52);
        auVar71 = vfmadd231ps_fma(auVar169,auVar72,auVar51);
        auVar72 = vfmadd231ps_fma(auVar143,auVar72,auVar182);
        auVar152._16_16_ = auVar74;
        auVar152._0_16_ = auVar74;
        auVar161._16_16_ = auVar73;
        auVar161._0_16_ = auVar73;
        auVar167._16_16_ = auVar71;
        auVar167._0_16_ = auVar71;
        auVar106 = vpermps_avx512vl(auVar242._0_32_,ZEXT1632(auVar53));
        auVar93 = vsubps_avx(auVar161,auVar152);
        auVar73 = vfmadd213ps_fma(auVar93,auVar106,auVar152);
        auVar93 = vsubps_avx(auVar167,auVar161);
        auVar84 = vfmadd213ps_fma(auVar93,auVar106,auVar161);
        auVar74 = vsubps_avx(auVar72,auVar71);
        auVar162._16_16_ = auVar74;
        auVar162._0_16_ = auVar74;
        auVar74 = vfmadd213ps_fma(auVar162,auVar106,auVar167);
        auVar93 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar73));
        auVar73 = vfmadd213ps_fma(auVar93,auVar106,ZEXT1632(auVar73));
        auVar93 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar84));
        auVar74 = vfmadd213ps_fma(auVar93,auVar106,ZEXT1632(auVar84));
        auVar93 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar73));
        auVar227 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar93,auVar106);
        auVar93 = vmulps_avx512vl(auVar93,auVar239._0_32_);
        auVar112._16_16_ = auVar93._16_16_;
        fVar199 = fVar123 * 0.33333334;
        auVar170._0_8_ =
             CONCAT44(auVar227._4_4_ + fVar199 * auVar93._4_4_,
                      auVar227._0_4_ + fVar199 * auVar93._0_4_);
        auVar170._8_4_ = auVar227._8_4_ + fVar199 * auVar93._8_4_;
        auVar170._12_4_ = auVar227._12_4_ + fVar199 * auVar93._12_4_;
        auVar157._0_4_ = fVar199 * auVar93._16_4_;
        auVar157._4_4_ = fVar199 * auVar93._20_4_;
        auVar157._8_4_ = fVar199 * auVar93._24_4_;
        auVar157._12_4_ = fVar199 * auVar93._28_4_;
        auVar81 = vsubps_avx((undefined1  [16])0x0,auVar157);
        auVar84 = vshufpd_avx(auVar227,auVar227,3);
        auVar87 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar74 = vsubps_avx(auVar84,auVar227);
        auVar73 = vsubps_avx(auVar87,(undefined1  [16])0x0);
        auVar183._0_4_ = auVar74._0_4_ + auVar73._0_4_;
        auVar183._4_4_ = auVar74._4_4_ + auVar73._4_4_;
        auVar183._8_4_ = auVar74._8_4_ + auVar73._8_4_;
        auVar183._12_4_ = auVar74._12_4_ + auVar73._12_4_;
        auVar74 = vshufps_avx(auVar227,auVar227,0xb1);
        auVar73 = vshufps_avx(auVar170,auVar170,0xb1);
        auVar71 = vshufps_avx(auVar81,auVar81,0xb1);
        auVar72 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar229._4_4_ = auVar183._0_4_;
        auVar229._0_4_ = auVar183._0_4_;
        auVar229._8_4_ = auVar183._0_4_;
        auVar229._12_4_ = auVar183._0_4_;
        auVar77 = vshufps_avx(auVar183,auVar183,0x55);
        fVar199 = auVar77._0_4_;
        auVar192._0_4_ = auVar74._0_4_ * fVar199;
        fVar209 = auVar77._4_4_;
        auVar192._4_4_ = auVar74._4_4_ * fVar209;
        fVar211 = auVar77._8_4_;
        auVar192._8_4_ = auVar74._8_4_ * fVar211;
        fVar208 = auVar77._12_4_;
        auVar192._12_4_ = auVar74._12_4_ * fVar208;
        auVar200._0_4_ = auVar73._0_4_ * fVar199;
        auVar200._4_4_ = auVar73._4_4_ * fVar209;
        auVar200._8_4_ = auVar73._8_4_ * fVar211;
        auVar200._12_4_ = auVar73._12_4_ * fVar208;
        auVar214._0_4_ = auVar71._0_4_ * fVar199;
        auVar214._4_4_ = auVar71._4_4_ * fVar209;
        auVar214._8_4_ = auVar71._8_4_ * fVar211;
        auVar214._12_4_ = auVar71._12_4_ * fVar208;
        auVar184._0_4_ = auVar72._0_4_ * fVar199;
        auVar184._4_4_ = auVar72._4_4_ * fVar209;
        auVar184._8_4_ = auVar72._8_4_ * fVar211;
        auVar184._12_4_ = auVar72._12_4_ * fVar208;
        auVar74 = vfmadd231ps_fma(auVar192,auVar229,auVar227);
        auVar73 = vfmadd231ps_fma(auVar200,auVar229,auVar170);
        auVar79 = vfmadd231ps_fma(auVar214,auVar229,auVar81);
        auVar80 = vfmadd231ps_fma(auVar184,(undefined1  [16])0x0,auVar229);
        auVar77 = vshufpd_avx(auVar74,auVar74,1);
        auVar78 = vshufpd_avx(auVar73,auVar73,1);
        auVar75 = vshufpd_avx512vl(auVar79,auVar79,1);
        auVar76 = vshufpd_avx512vl(auVar80,auVar80,1);
        auVar71 = vminss_avx(auVar74,auVar73);
        auVar74 = vmaxss_avx(auVar73,auVar74);
        auVar72 = vminss_avx(auVar79,auVar80);
        auVar73 = vmaxss_avx(auVar80,auVar79);
        auVar71 = vminss_avx(auVar71,auVar72);
        auVar74 = vmaxss_avx(auVar73,auVar74);
        auVar72 = vminss_avx(auVar77,auVar78);
        auVar73 = vmaxss_avx(auVar78,auVar77);
        auVar77 = vminss_avx512f(auVar75,auVar76);
        auVar78 = vmaxss_avx512f(auVar76,auVar75);
        auVar73 = vmaxss_avx(auVar78,auVar73);
        auVar72 = vminss_avx512f(auVar72,auVar77);
        fVar209 = auVar73._0_4_;
        fVar199 = auVar74._0_4_;
        if (auVar71._0_4_ < 0.0001) {
          bVar40 = fVar209 == -0.0001;
          bVar37 = NAN(fVar209);
          if (fVar209 <= -0.0001) goto LAB_01a64536;
          break;
        }
LAB_01a64536:
        vucomiss_avx512f(auVar72);
        bVar40 = fVar209 <= -0.0001;
        bVar38 = -0.0001 < fVar199;
        bVar37 = bVar40;
        if (!bVar40) break;
        uVar13 = vcmpps_avx512vl(auVar71,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar14 = vcmpps_avx512vl(auVar72,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar29 = (uint)uVar13 & (uint)uVar14;
        bVar26 = (uVar29 & 1) == 0;
        bVar40 = bVar38 && bVar26;
        bVar37 = bVar38 && (uVar29 & 1) == 0;
      } while (!bVar38 || !bVar26);
      auVar79 = auVar244._0_16_;
      vcmpss_avx512f(auVar71,auVar79,1);
      uVar13 = vcmpss_avx512f(auVar74,auVar79,1);
      bVar38 = (bool)((byte)uVar13 & 1);
      auVar112._0_16_ = auVar245._0_16_;
      auVar111._4_28_ = auVar112._4_28_;
      auVar111._0_4_ = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * auVar245._0_4_);
      vucomiss_avx512f(auVar111._0_16_);
      bVar37 = (bool)(!bVar40 | bVar37);
      bVar38 = bVar37 == false;
      auVar114._16_16_ = auVar112._16_16_;
      auVar114._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar113._4_28_ = auVar114._4_28_;
      auVar113._0_4_ = (uint)bVar37 * auVar244._0_4_ + (uint)!bVar37 * 0x7f800000;
      auVar78 = auVar113._0_16_;
      auVar116._16_16_ = auVar112._16_16_;
      auVar116._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar115._4_28_ = auVar116._4_28_;
      auVar115._0_4_ = (uint)bVar37 * auVar244._0_4_ + (uint)!bVar37 * -0x800000;
      auVar77 = auVar115._0_16_;
      uVar13 = vcmpss_avx512f(auVar72,auVar79,1);
      bVar40 = (bool)((byte)uVar13 & 1);
      auVar118._16_16_ = auVar112._16_16_;
      auVar118._0_16_ = auVar245._0_16_;
      auVar117._4_28_ = auVar118._4_28_;
      auVar117._0_4_ = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * auVar245._0_4_);
      vucomiss_avx512f(auVar117._0_16_);
      if ((bVar37) || (bVar38)) {
        auVar72 = vucomiss_avx512f(auVar71);
        if ((bVar37) || (bVar38)) {
          auVar19._8_4_ = 0x80000000;
          auVar19._0_8_ = 0x8000000080000000;
          auVar19._12_4_ = 0x80000000;
          auVar80 = vxorps_avx512vl(auVar71,auVar19);
          auVar71 = vsubss_avx512f(auVar72,auVar71);
          auVar71 = vdivss_avx512f(auVar80,auVar71);
          auVar72 = vsubss_avx512f(ZEXT416(0x3f800000),auVar71);
          auVar72 = vfmadd213ss_avx512f(auVar72,auVar79,auVar71);
          auVar71 = auVar72;
        }
        else {
          auVar71 = vxorps_avx512vl(auVar72,auVar72);
          vucomiss_avx512f(auVar71);
          auVar72 = ZEXT416(0x3f800000);
          if ((bVar37) || (bVar38)) {
            auVar72 = SUB6416(ZEXT464(0xff800000),0);
            auVar71 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar78 = vminss_avx512f(auVar78,auVar71);
        auVar77 = vmaxss_avx(auVar72,auVar77);
      }
      auVar245 = ZEXT464(0x3f800000);
      uVar13 = vcmpss_avx512f(auVar73,auVar79,1);
      bVar40 = (bool)((byte)uVar13 & 1);
      auVar73 = auVar245._0_16_;
      fVar211 = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * 0x3f800000);
      if ((auVar111._0_4_ != fVar211) || (NAN(auVar111._0_4_) || NAN(fVar211))) {
        if ((fVar209 != fVar199) || (NAN(fVar209) || NAN(fVar199))) {
          auVar18._8_4_ = 0x80000000;
          auVar18._0_8_ = 0x8000000080000000;
          auVar18._12_4_ = 0x80000000;
          auVar74 = vxorps_avx512vl(auVar74,auVar18);
          auVar185._0_4_ = auVar74._0_4_ / (fVar209 - fVar199);
          auVar185._4_12_ = auVar74._4_12_;
          auVar74 = vsubss_avx512f(auVar73,auVar185);
          auVar74 = vfmadd213ss_avx512f(auVar74,auVar79,auVar185);
          auVar71 = auVar74;
        }
        else if ((fVar199 != 0.0) ||
                (auVar74 = auVar73, auVar71 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar199))) {
          auVar74 = SUB6416(ZEXT464(0xff800000),0);
          auVar71 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar78 = vminss_avx(auVar78,auVar71);
        auVar77 = vmaxss_avx(auVar74,auVar77);
      }
      bVar40 = auVar117._0_4_ != fVar211;
      auVar74 = vminss_avx512f(auVar78,auVar73);
      auVar120._16_16_ = auVar112._16_16_;
      auVar120._0_16_ = auVar78;
      auVar119._4_28_ = auVar120._4_28_;
      auVar119._0_4_ = (uint)bVar40 * auVar74._0_4_ + (uint)!bVar40 * auVar78._0_4_;
      auVar74 = vmaxss_avx512f(auVar73,auVar77);
      auVar122._16_16_ = auVar112._16_16_;
      auVar122._0_16_ = auVar77;
      auVar121._4_28_ = auVar122._4_28_;
      auVar121._0_4_ = (uint)bVar40 * auVar74._0_4_ + (uint)!bVar40 * auVar77._0_4_;
      auVar74 = vmaxss_avx512f(auVar79,auVar119._0_16_);
      auVar71 = vminss_avx512f(auVar121._0_16_,auVar73);
    } while (auVar71._0_4_ < auVar74._0_4_);
    auVar79 = vmaxss_avx512f(auVar79,ZEXT416((uint)(auVar74._0_4_ + -0.1)));
    auVar80 = vminss_avx512f(ZEXT416((uint)(auVar71._0_4_ + 0.1)),auVar73);
    auVar144._0_8_ = auVar227._0_8_;
    auVar144._8_8_ = auVar144._0_8_;
    auVar201._8_8_ = auVar170._0_8_;
    auVar201._0_8_ = auVar170._0_8_;
    auVar215._8_8_ = auVar81._0_8_;
    auVar215._0_8_ = auVar81._0_8_;
    auVar74 = vshufpd_avx(auVar170,auVar170,3);
    auVar71 = vshufpd_avx(auVar81,auVar81,3);
    auVar72 = vshufps_avx(auVar79,auVar80,0);
    auVar78 = vsubps_avx512vl(auVar174,auVar72);
    fVar199 = auVar72._0_4_;
    auVar164._0_4_ = fVar199 * auVar84._0_4_;
    fVar209 = auVar72._4_4_;
    auVar164._4_4_ = fVar209 * auVar84._4_4_;
    fVar211 = auVar72._8_4_;
    auVar164._8_4_ = fVar211 * auVar84._8_4_;
    fVar208 = auVar72._12_4_;
    auVar164._12_4_ = fVar208 * auVar84._12_4_;
    auVar171._0_4_ = fVar199 * auVar74._0_4_;
    auVar171._4_4_ = fVar209 * auVar74._4_4_;
    auVar171._8_4_ = fVar211 * auVar74._8_4_;
    auVar171._12_4_ = fVar208 * auVar74._12_4_;
    auVar232._0_4_ = auVar71._0_4_ * fVar199;
    auVar232._4_4_ = auVar71._4_4_ * fVar209;
    auVar232._8_4_ = auVar71._8_4_ * fVar211;
    auVar232._12_4_ = auVar71._12_4_ * fVar208;
    auVar158._0_4_ = fVar199 * auVar87._0_4_;
    auVar158._4_4_ = fVar209 * auVar87._4_4_;
    auVar158._8_4_ = fVar211 * auVar87._8_4_;
    auVar158._12_4_ = fVar208 * auVar87._12_4_;
    auVar84 = vfmadd231ps_fma(auVar164,auVar78,auVar144);
    auVar87 = vfmadd231ps_fma(auVar171,auVar78,auVar201);
    auVar77 = vfmadd231ps_fma(auVar232,auVar78,auVar215);
    auVar78 = vfmadd231ps_fma(auVar158,auVar78,ZEXT816(0));
    auVar71 = vsubss_avx512f(auVar73,auVar79);
    auVar74 = vmovshdup_avx(auVar82);
    auVar227 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar79._0_4_)),auVar82,auVar71);
    auVar71 = vsubss_avx512f(auVar73,auVar80);
    auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar80._0_4_)),auVar82,auVar71);
    auVar81 = vdivss_avx512f(auVar73,ZEXT416((uint)fVar123));
    auVar82 = vsubps_avx(auVar87,auVar84);
    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar71 = vmulps_avx512vl(auVar82,auVar79);
    auVar82 = vsubps_avx(auVar77,auVar87);
    auVar72 = vmulps_avx512vl(auVar82,auVar79);
    auVar82 = vsubps_avx(auVar78,auVar77);
    auVar82 = vmulps_avx512vl(auVar82,auVar79);
    auVar74 = vminps_avx(auVar72,auVar82);
    auVar82 = vmaxps_avx(auVar72,auVar82);
    auVar74 = vminps_avx(auVar71,auVar74);
    auVar82 = vmaxps_avx(auVar71,auVar82);
    auVar71 = vshufpd_avx(auVar74,auVar74,3);
    auVar72 = vshufpd_avx(auVar82,auVar82,3);
    auVar74 = vminps_avx(auVar74,auVar71);
    auVar82 = vmaxps_avx(auVar82,auVar72);
    fVar123 = auVar81._0_4_;
    auVar186._0_4_ = auVar74._0_4_ * fVar123;
    auVar186._4_4_ = auVar74._4_4_ * fVar123;
    auVar186._8_4_ = auVar74._8_4_ * fVar123;
    auVar186._12_4_ = auVar74._12_4_ * fVar123;
    auVar175._0_4_ = fVar123 * auVar82._0_4_;
    auVar175._4_4_ = fVar123 * auVar82._4_4_;
    auVar175._8_4_ = fVar123 * auVar82._8_4_;
    auVar175._12_4_ = fVar123 * auVar82._12_4_;
    auVar81 = vdivss_avx512f(auVar73,ZEXT416((uint)(auVar75._0_4_ - auVar227._0_4_)));
    auVar82 = vshufpd_avx(auVar84,auVar84,3);
    auVar74 = vshufpd_avx(auVar87,auVar87,3);
    auVar71 = vshufpd_avx(auVar77,auVar77,3);
    auVar72 = vshufpd_avx(auVar78,auVar78,3);
    auVar82 = vsubps_avx(auVar82,auVar84);
    auVar84 = vsubps_avx(auVar74,auVar87);
    auVar87 = vsubps_avx(auVar71,auVar77);
    auVar72 = vsubps_avx(auVar72,auVar78);
    auVar74 = vminps_avx(auVar82,auVar84);
    auVar82 = vmaxps_avx(auVar82,auVar84);
    auVar71 = vminps_avx(auVar87,auVar72);
    auVar71 = vminps_avx(auVar74,auVar71);
    auVar74 = vmaxps_avx(auVar87,auVar72);
    auVar82 = vmaxps_avx(auVar82,auVar74);
    fVar123 = auVar81._0_4_;
    auVar216._0_4_ = fVar123 * auVar71._0_4_;
    auVar216._4_4_ = fVar123 * auVar71._4_4_;
    auVar216._8_4_ = fVar123 * auVar71._8_4_;
    auVar216._12_4_ = fVar123 * auVar71._12_4_;
    auVar202._0_4_ = fVar123 * auVar82._0_4_;
    auVar202._4_4_ = fVar123 * auVar82._4_4_;
    auVar202._8_4_ = fVar123 * auVar82._8_4_;
    auVar202._12_4_ = fVar123 * auVar82._12_4_;
    auVar72 = vinsertps_avx(auVar53,auVar227,0x10);
    auVar76 = vpermt2ps_avx512vl(auVar53,_DAT_01fb9f90,auVar75);
    auVar132._0_4_ = auVar72._0_4_ + auVar76._0_4_;
    auVar132._4_4_ = auVar72._4_4_ + auVar76._4_4_;
    auVar132._8_4_ = auVar72._8_4_ + auVar76._8_4_;
    auVar132._12_4_ = auVar72._12_4_ + auVar76._12_4_;
    auVar81 = vmulps_avx512vl(auVar132,auVar237._0_16_);
    auVar74 = vshufps_avx(auVar81,auVar81,0x54);
    uVar131 = auVar81._0_4_;
    auVar133._4_4_ = uVar131;
    auVar133._0_4_ = uVar131;
    auVar133._8_4_ = uVar131;
    auVar133._12_4_ = uVar131;
    auVar71 = vfmadd213ps_fma(auVar48,auVar133,auVar5);
    auVar84 = vfmadd213ps_fma(auVar65,auVar133,auVar43);
    auVar87 = vfmadd213ps_fma(auVar66,auVar133,auVar45);
    auVar82 = vsubps_avx(auVar84,auVar71);
    auVar71 = vfmadd213ps_fma(auVar82,auVar133,auVar71);
    auVar82 = vsubps_avx(auVar87,auVar84);
    auVar82 = vfmadd213ps_fma(auVar82,auVar133,auVar84);
    auVar82 = vsubps_avx(auVar82,auVar71);
    auVar71 = vfmadd231ps_fma(auVar71,auVar82,auVar133);
    auVar77 = vmulps_avx512vl(auVar82,auVar79);
    auVar224._8_8_ = auVar71._0_8_;
    auVar224._0_8_ = auVar71._0_8_;
    auVar82 = vshufpd_avx(auVar71,auVar71,3);
    auVar71 = vshufps_avx(auVar81,auVar81,0x55);
    auVar84 = vsubps_avx(auVar82,auVar224);
    auVar87 = vfmadd231ps_fma(auVar224,auVar71,auVar84);
    auVar233._8_8_ = auVar77._0_8_;
    auVar233._0_8_ = auVar77._0_8_;
    auVar82 = vshufpd_avx(auVar77,auVar77,3);
    auVar82 = vsubps_avx512vl(auVar82,auVar233);
    auVar82 = vfmadd213ps_avx512vl(auVar82,auVar71,auVar233);
    auVar71 = vxorps_avx512vl(auVar84,auVar236._0_16_);
    auVar77 = vmovshdup_avx512vl(auVar82);
    auVar78 = vxorps_avx512vl(auVar77,auVar236._0_16_);
    auVar79 = vmovshdup_avx512vl(auVar84);
    auVar78 = vpermt2ps_avx512vl(auVar78,ZEXT416(5),auVar84);
    auVar83 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
    auVar244 = ZEXT1664(auVar83);
    auVar84 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar77._0_4_ * auVar84._0_4_)),auVar82,auVar79);
    auVar71 = vpermt2ps_avx512vl(auVar82,SUB6416(ZEXT464(4),0),auVar71);
    auVar159._0_4_ = auVar84._0_4_;
    auVar159._4_4_ = auVar159._0_4_;
    auVar159._8_4_ = auVar159._0_4_;
    auVar159._12_4_ = auVar159._0_4_;
    auVar82 = vdivps_avx(auVar78,auVar159);
    auVar85 = vdivps_avx512vl(auVar71,auVar159);
    fVar123 = auVar87._0_4_;
    auVar71 = vshufps_avx(auVar87,auVar87,0x55);
    auVar225._0_4_ = fVar123 * auVar82._0_4_ + auVar71._0_4_ * auVar85._0_4_;
    auVar225._4_4_ = fVar123 * auVar82._4_4_ + auVar71._4_4_ * auVar85._4_4_;
    auVar225._8_4_ = fVar123 * auVar82._8_4_ + auVar71._8_4_ * auVar85._8_4_;
    auVar225._12_4_ = fVar123 * auVar82._12_4_ + auVar71._12_4_ * auVar85._12_4_;
    auVar79 = vsubps_avx(auVar74,auVar225);
    auVar71 = vmovshdup_avx(auVar82);
    auVar74 = vinsertps_avx(auVar186,auVar216,0x1c);
    auVar234._0_4_ = auVar71._0_4_ * auVar74._0_4_;
    auVar234._4_4_ = auVar71._4_4_ * auVar74._4_4_;
    auVar234._8_4_ = auVar71._8_4_ * auVar74._8_4_;
    auVar234._12_4_ = auVar71._12_4_ * auVar74._12_4_;
    auVar80 = vinsertps_avx512f(auVar175,auVar202,0x1c);
    auVar71 = vmulps_avx512vl(auVar71,auVar80);
    auVar78 = vminps_avx512vl(auVar234,auVar71);
    auVar87 = vmaxps_avx(auVar71,auVar234);
    auVar77 = vmovshdup_avx(auVar85);
    auVar71 = vinsertps_avx(auVar216,auVar186,0x4c);
    auVar217._0_4_ = auVar77._0_4_ * auVar71._0_4_;
    auVar217._4_4_ = auVar77._4_4_ * auVar71._4_4_;
    auVar217._8_4_ = auVar77._8_4_ * auVar71._8_4_;
    auVar217._12_4_ = auVar77._12_4_ * auVar71._12_4_;
    auVar84 = vinsertps_avx(auVar202,auVar175,0x4c);
    auVar203._0_4_ = auVar77._0_4_ * auVar84._0_4_;
    auVar203._4_4_ = auVar77._4_4_ * auVar84._4_4_;
    auVar203._8_4_ = auVar77._8_4_ * auVar84._8_4_;
    auVar203._12_4_ = auVar77._12_4_ * auVar84._12_4_;
    auVar77 = vminps_avx(auVar217,auVar203);
    auVar78 = vaddps_avx512vl(auVar78,auVar77);
    auVar77 = vmaxps_avx(auVar203,auVar217);
    auVar204._0_4_ = auVar87._0_4_ + auVar77._0_4_;
    auVar204._4_4_ = auVar87._4_4_ + auVar77._4_4_;
    auVar204._8_4_ = auVar87._8_4_ + auVar77._8_4_;
    auVar204._12_4_ = auVar87._12_4_ + auVar77._12_4_;
    auVar218._8_8_ = 0x3f80000000000000;
    auVar218._0_8_ = 0x3f80000000000000;
    auVar87 = vsubps_avx(auVar218,auVar204);
    auVar77 = vsubps_avx(auVar218,auVar78);
    auVar78 = vsubps_avx(auVar72,auVar81);
    auVar81 = vsubps_avx(auVar76,auVar81);
    fVar208 = auVar78._0_4_;
    auVar235._0_4_ = fVar208 * auVar87._0_4_;
    fVar210 = auVar78._4_4_;
    auVar235._4_4_ = fVar210 * auVar87._4_4_;
    fVar212 = auVar78._8_4_;
    auVar235._8_4_ = fVar212 * auVar87._8_4_;
    fVar213 = auVar78._12_4_;
    auVar235._12_4_ = fVar213 * auVar87._12_4_;
    auVar86 = vbroadcastss_avx512vl(auVar82);
    auVar74 = vmulps_avx512vl(auVar86,auVar74);
    auVar80 = vmulps_avx512vl(auVar86,auVar80);
    auVar86 = vminps_avx512vl(auVar74,auVar80);
    auVar80 = vmaxps_avx512vl(auVar80,auVar74);
    auVar74 = vbroadcastss_avx512vl(auVar85);
    auVar71 = vmulps_avx512vl(auVar74,auVar71);
    auVar74 = vmulps_avx512vl(auVar74,auVar84);
    auVar84 = vminps_avx512vl(auVar71,auVar74);
    auVar84 = vaddps_avx512vl(auVar86,auVar84);
    auVar78 = vmulps_avx512vl(auVar78,auVar77);
    fVar123 = auVar81._0_4_;
    auVar205._0_4_ = fVar123 * auVar87._0_4_;
    fVar199 = auVar81._4_4_;
    auVar205._4_4_ = fVar199 * auVar87._4_4_;
    fVar209 = auVar81._8_4_;
    auVar205._8_4_ = fVar209 * auVar87._8_4_;
    fVar211 = auVar81._12_4_;
    auVar205._12_4_ = fVar211 * auVar87._12_4_;
    auVar219._0_4_ = fVar123 * auVar77._0_4_;
    auVar219._4_4_ = fVar199 * auVar77._4_4_;
    auVar219._8_4_ = fVar209 * auVar77._8_4_;
    auVar219._12_4_ = fVar211 * auVar77._12_4_;
    auVar74 = vmaxps_avx(auVar74,auVar71);
    auVar176._0_4_ = auVar80._0_4_ + auVar74._0_4_;
    auVar176._4_4_ = auVar80._4_4_ + auVar74._4_4_;
    auVar176._8_4_ = auVar80._8_4_ + auVar74._8_4_;
    auVar176._12_4_ = auVar80._12_4_ + auVar74._12_4_;
    auVar187._8_8_ = 0x3f800000;
    auVar187._0_8_ = 0x3f800000;
    auVar74 = vsubps_avx(auVar187,auVar176);
    auVar71 = vsubps_avx512vl(auVar187,auVar84);
    auVar230._0_4_ = fVar208 * auVar74._0_4_;
    auVar230._4_4_ = fVar210 * auVar74._4_4_;
    auVar230._8_4_ = fVar212 * auVar74._8_4_;
    auVar230._12_4_ = fVar213 * auVar74._12_4_;
    auVar226._0_4_ = fVar208 * auVar71._0_4_;
    auVar226._4_4_ = fVar210 * auVar71._4_4_;
    auVar226._8_4_ = fVar212 * auVar71._8_4_;
    auVar226._12_4_ = fVar213 * auVar71._12_4_;
    auVar177._0_4_ = fVar123 * auVar74._0_4_;
    auVar177._4_4_ = fVar199 * auVar74._4_4_;
    auVar177._8_4_ = fVar209 * auVar74._8_4_;
    auVar177._12_4_ = fVar211 * auVar74._12_4_;
    auVar188._0_4_ = fVar123 * auVar71._0_4_;
    auVar188._4_4_ = fVar199 * auVar71._4_4_;
    auVar188._8_4_ = fVar209 * auVar71._8_4_;
    auVar188._12_4_ = fVar211 * auVar71._12_4_;
    auVar74 = vminps_avx(auVar230,auVar226);
    auVar71 = vminps_avx512vl(auVar177,auVar188);
    auVar84 = vminps_avx512vl(auVar74,auVar71);
    auVar74 = vmaxps_avx(auVar226,auVar230);
    auVar71 = vmaxps_avx(auVar188,auVar177);
    auVar71 = vmaxps_avx(auVar71,auVar74);
    auVar87 = vminps_avx512vl(auVar235,auVar78);
    auVar74 = vminps_avx(auVar205,auVar219);
    auVar74 = vminps_avx(auVar87,auVar74);
    auVar74 = vhaddps_avx(auVar84,auVar74);
    auVar87 = vmaxps_avx512vl(auVar78,auVar235);
    auVar84 = vmaxps_avx(auVar219,auVar205);
    auVar84 = vmaxps_avx(auVar84,auVar87);
    auVar71 = vhaddps_avx(auVar71,auVar84);
    auVar74 = vshufps_avx(auVar74,auVar74,0xe8);
    auVar71 = vshufps_avx(auVar71,auVar71,0xe8);
    auVar178._0_4_ = auVar74._0_4_ + auVar79._0_4_;
    auVar178._4_4_ = auVar74._4_4_ + auVar79._4_4_;
    auVar178._8_4_ = auVar74._8_4_ + auVar79._8_4_;
    auVar178._12_4_ = auVar74._12_4_ + auVar79._12_4_;
    auVar189._0_4_ = auVar71._0_4_ + auVar79._0_4_;
    auVar189._4_4_ = auVar71._4_4_ + auVar79._4_4_;
    auVar189._8_4_ = auVar71._8_4_ + auVar79._8_4_;
    auVar189._12_4_ = auVar71._12_4_ + auVar79._12_4_;
    auVar74 = vmaxps_avx(auVar72,auVar178);
    auVar71 = vminps_avx(auVar189,auVar76);
    uVar34 = vcmpps_avx512vl(auVar71,auVar74,1);
  } while ((uVar34 & 3) != 0);
  uVar34 = vcmpps_avx512vl(auVar189,auVar76,1);
  uVar13 = vcmpps_avx512vl(auVar53,auVar178,1);
  if (((ushort)uVar13 & (ushort)uVar34 & 1) == 0) {
    bVar28 = 0;
  }
  else {
    auVar74 = vmovshdup_avx(auVar178);
    bVar28 = auVar227._0_4_ < auVar74._0_4_ & (byte)(uVar34 >> 1) & 0x7f;
  }
  p03.field_0.i[0] = auVar46._0_4_;
  p03.field_0.i[1] = auVar46._4_4_;
  p03.field_0.i[2] = auVar46._8_4_;
  p03.field_0.i[3] = auVar46._12_4_;
  if (((3 < (uint)uVar33 || uVar7 != 0 && !bVar39) | bVar28) != 1) goto LAB_01a651ca;
  lVar30 = 0xc9;
  do {
    lVar30 = lVar30 + -1;
    if (lVar30 == 0) goto LAB_01a6430c;
    auVar53 = vsubss_avx512f(auVar73,auVar79);
    fVar209 = auVar53._0_4_;
    fVar123 = fVar209 * fVar209 * fVar209;
    fVar211 = auVar79._0_4_;
    fVar199 = fVar211 * 3.0 * fVar209 * fVar209;
    fVar209 = fVar209 * fVar211 * fVar211 * 3.0;
    auVar149._4_4_ = fVar123;
    auVar149._0_4_ = fVar123;
    auVar149._8_4_ = fVar123;
    auVar149._12_4_ = fVar123;
    auVar145._4_4_ = fVar199;
    auVar145._0_4_ = fVar199;
    auVar145._8_4_ = fVar199;
    auVar145._12_4_ = fVar199;
    auVar125._4_4_ = fVar209;
    auVar125._0_4_ = fVar209;
    auVar125._8_4_ = fVar209;
    auVar125._12_4_ = fVar209;
    fVar211 = fVar211 * fVar211 * fVar211;
    auVar165._0_4_ = p03.field_0.v[0] * fVar211;
    auVar165._4_4_ = p03.field_0.v[1] * fVar211;
    auVar165._8_4_ = p03.field_0.v[2] * fVar211;
    auVar165._12_4_ = p03.field_0.v[3] * fVar211;
    auVar53 = vfmadd231ps_fma(auVar165,auVar45,auVar125);
    auVar53 = vfmadd231ps_fma(auVar53,auVar43,auVar145);
    auVar53 = vfmadd231ps_fma(auVar53,auVar5,auVar149);
    auVar126._8_8_ = auVar53._0_8_;
    auVar126._0_8_ = auVar53._0_8_;
    auVar53 = vshufpd_avx(auVar53,auVar53,3);
    auVar74 = vshufps_avx(auVar79,auVar79,0x55);
    auVar53 = vsubps_avx(auVar53,auVar126);
    auVar74 = vfmadd213ps_fma(auVar53,auVar74,auVar126);
    fVar123 = auVar74._0_4_;
    auVar53 = vshufps_avx(auVar74,auVar74,0x55);
    auVar127._0_4_ = auVar82._0_4_ * fVar123 + auVar85._0_4_ * auVar53._0_4_;
    auVar127._4_4_ = auVar82._4_4_ * fVar123 + auVar85._4_4_ * auVar53._4_4_;
    auVar127._8_4_ = auVar82._8_4_ * fVar123 + auVar85._8_4_ * auVar53._8_4_;
    auVar127._12_4_ = auVar82._12_4_ * fVar123 + auVar85._12_4_ * auVar53._12_4_;
    auVar79 = vsubps_avx(auVar79,auVar127);
    auVar53 = vandps_avx512vl(auVar74,auVar238._0_16_);
    auVar74 = vprolq_avx512vl(auVar53,0x20);
    auVar53 = vmaxss_avx(auVar74,auVar53);
    bVar39 = fVar197 < auVar53._0_4_;
  } while (fVar197 <= auVar53._0_4_);
  auVar53 = vucomiss_avx512f(auVar83);
  if (bVar39) goto LAB_01a6430c;
  auVar82 = vucomiss_avx512f(auVar53);
  auVar245 = ZEXT1664(auVar82);
  if (bVar39) goto LAB_01a6430c;
  vmovshdup_avx(auVar53);
  auVar82 = vucomiss_avx512f(auVar83);
  if (bVar39) goto LAB_01a6430c;
  auVar74 = vucomiss_avx512f(auVar82);
  auVar245 = ZEXT1664(auVar74);
  if (bVar39) goto LAB_01a6430c;
  auVar73 = vinsertps_avx(ZEXT416((uint)(pLVar27->vx).field_0.m128[2]),
                          ZEXT416(*(uint *)((long)&(pLVar27->vy).field_0 + 8)),0x1c);
  auVar81 = vinsertps_avx(auVar73,ZEXT416(*(uint *)((long)&(pLVar27->vz).field_0 + 8)),0x28);
  auVar73 = vdpps_avx(auVar81,auVar49,0x7f);
  auVar71 = vdpps_avx(auVar81,auVar60,0x7f);
  auVar72 = vdpps_avx(auVar81,auVar61,0x7f);
  auVar84 = vdpps_avx(auVar81,auVar44,0x7f);
  auVar87 = vdpps_avx(auVar81,auVar42,0x7f);
  auVar77 = vdpps_avx(auVar81,auVar62,0x7f);
  auVar78 = vdpps_avx(auVar81,auVar63,0x7f);
  auVar81 = vdpps_avx(auVar81,auVar64,0x7f);
  auVar79 = vsubss_avx512f(auVar74,auVar82);
  fVar123 = auVar82._0_4_;
  auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar123 * auVar87._0_4_)),auVar79,auVar73);
  auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ * fVar123)),auVar79,auVar71);
  auVar71 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ * fVar123)),auVar79,auVar72);
  auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar123 * auVar81._0_4_)),auVar79,auVar84);
  auVar74 = vsubss_avx512f(auVar74,auVar53);
  auVar172._0_4_ = auVar74._0_4_;
  fVar123 = auVar172._0_4_ * auVar172._0_4_ * auVar172._0_4_;
  local_d8 = auVar53._0_4_;
  fVar199 = local_d8 * 3.0 * auVar172._0_4_ * auVar172._0_4_;
  fVar209 = auVar172._0_4_ * local_d8 * local_d8 * 3.0;
  fVar211 = local_d8 * local_d8 * local_d8;
  auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar72._0_4_)),ZEXT416((uint)fVar209),auVar71)
  ;
  auVar74 = vfmadd231ss_fma(auVar74,ZEXT416((uint)fVar199),auVar73);
  vfmadd231ss_fma(auVar74,ZEXT416((uint)fVar123),auVar82);
  auVar82 = vucomiss_avx512f(ZEXT416(uVar1));
  if (bVar39) goto LAB_01a6430c;
  fVar208 = *(float *)(ray + k * 4 + 0x80);
  if (fVar208 < auVar82._0_4_) goto LAB_01a6430c;
  local_c8 = vshufps_avx(auVar53,auVar53,0x55);
  auVar73 = vsubps_avx512vl(auVar174,local_c8);
  fVar210 = local_c8._0_4_;
  auVar190._0_4_ = fVar210 * auVar228._0_4_;
  fVar212 = local_c8._4_4_;
  auVar190._4_4_ = fVar212 * auVar228._4_4_;
  fVar213 = local_c8._8_4_;
  auVar190._8_4_ = fVar213 * auVar228._8_4_;
  fVar221 = local_c8._12_4_;
  auVar190._12_4_ = fVar221 * auVar228._12_4_;
  local_298 = auVar58._0_4_;
  fStack_294 = auVar58._4_4_;
  fStack_290 = auVar58._8_4_;
  fStack_28c = auVar58._12_4_;
  auVar193._0_4_ = fVar210 * local_298;
  auVar193._4_4_ = fVar212 * fStack_294;
  auVar193._8_4_ = fVar213 * fStack_290;
  auVar193._12_4_ = fVar221 * fStack_28c;
  local_2a8 = auVar59._0_4_;
  fStack_2a4 = auVar59._4_4_;
  fStack_2a0 = auVar59._8_4_;
  fStack_29c = auVar59._12_4_;
  auVar206._0_4_ = fVar210 * local_2a8;
  auVar206._4_4_ = fVar212 * fStack_2a4;
  auVar206._8_4_ = fVar213 * fStack_2a0;
  auVar206._12_4_ = fVar221 * fStack_29c;
  local_268 = auVar55._0_4_;
  fStack_264 = auVar55._4_4_;
  fStack_260 = auVar55._8_4_;
  fStack_25c = auVar55._12_4_;
  auVar220._0_4_ = fVar210 * local_268;
  auVar220._4_4_ = fVar212 * fStack_264;
  auVar220._8_4_ = fVar213 * fStack_260;
  auVar220._12_4_ = fVar221 * fStack_25c;
  auVar53 = vfmadd231ps_fma(auVar190,auVar73,auVar50);
  auVar74 = vfmadd231ps_fma(auVar193,auVar73,auVar56);
  auVar174 = vfmadd231ps_fma(auVar206,auVar73,auVar57);
  auVar73 = vfmadd231ps_fma(auVar220,auVar73,auVar54);
  auVar53 = vsubps_avx(auVar74,auVar53);
  auVar74 = vsubps_avx(auVar174,auVar74);
  auVar174 = vsubps_avx(auVar73,auVar174);
  auVar207._0_4_ = auVar74._0_4_ * local_d8;
  auVar207._4_4_ = auVar74._4_4_ * local_d8;
  auVar207._8_4_ = auVar74._8_4_ * local_d8;
  auVar207._12_4_ = auVar74._12_4_ * local_d8;
  auVar172._4_4_ = auVar172._0_4_;
  auVar172._8_4_ = auVar172._0_4_;
  auVar172._12_4_ = auVar172._0_4_;
  auVar53 = vfmadd231ps_fma(auVar207,auVar172,auVar53);
  auVar179._0_4_ = auVar174._0_4_ * local_d8;
  auVar179._4_4_ = auVar174._4_4_ * local_d8;
  auVar179._8_4_ = auVar174._8_4_ * local_d8;
  auVar179._12_4_ = auVar174._12_4_ * local_d8;
  auVar74 = vfmadd231ps_fma(auVar179,auVar172,auVar74);
  auVar180._0_4_ = auVar74._0_4_ * local_d8;
  auVar180._4_4_ = auVar74._4_4_ * local_d8;
  auVar180._8_4_ = auVar74._8_4_ * local_d8;
  auVar180._12_4_ = auVar74._12_4_ * local_d8;
  auVar53 = vfmadd231ps_fma(auVar180,auVar172,auVar53);
  auVar17._8_4_ = 0x40400000;
  auVar17._0_8_ = 0x4040000040400000;
  auVar17._12_4_ = 0x40400000;
  auVar53 = vmulps_avx512vl(auVar53,auVar17);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar28 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01a651c2;
    local_2f8 = auVar69._0_4_;
    fStack_2f4 = auVar69._4_4_;
    fStack_2f0 = auVar69._8_4_;
    fStack_2ec = auVar69._12_4_;
    auVar166._0_4_ = fVar211 * local_2f8;
    auVar166._4_4_ = fVar211 * fStack_2f4;
    auVar166._8_4_ = fVar211 * fStack_2f0;
    auVar166._12_4_ = fVar211 * fStack_2ec;
    auVar150._4_4_ = fVar209;
    auVar150._0_4_ = fVar209;
    auVar150._8_4_ = fVar209;
    auVar150._12_4_ = fVar209;
    auVar74 = vfmadd132ps_fma(auVar150,auVar166,auVar68);
    auVar146._4_4_ = fVar199;
    auVar146._0_4_ = fVar199;
    auVar146._8_4_ = fVar199;
    auVar146._12_4_ = fVar199;
    auVar74 = vfmadd132ps_fma(auVar146,auVar74,auVar67);
    auVar134._4_4_ = fVar123;
    auVar134._0_4_ = fVar123;
    auVar134._8_4_ = fVar123;
    auVar134._12_4_ = fVar123;
    auVar73 = vfmadd132ps_fma(auVar134,auVar74,auVar41);
    auVar74 = vshufps_avx(auVar73,auVar73,0xc9);
    auVar174 = vshufps_avx(auVar53,auVar53,0xc9);
    auVar135._0_4_ = auVar73._0_4_ * auVar174._0_4_;
    auVar135._4_4_ = auVar73._4_4_ * auVar174._4_4_;
    auVar135._8_4_ = auVar73._8_4_ * auVar174._8_4_;
    auVar135._12_4_ = auVar73._12_4_ * auVar174._12_4_;
    auVar74 = vfmsub231ps_fma(auVar135,auVar53,auVar74);
    auVar53 = vshufps_avx(auVar74,auVar74,0x55);
    local_f8 = vshufps_avx(auVar74,auVar74,0xaa);
    local_e8 = auVar74._0_4_;
    local_108[0] = (RTCHitN)auVar53[0];
    local_108[1] = (RTCHitN)auVar53[1];
    local_108[2] = (RTCHitN)auVar53[2];
    local_108[3] = (RTCHitN)auVar53[3];
    local_108[4] = (RTCHitN)auVar53[4];
    local_108[5] = (RTCHitN)auVar53[5];
    local_108[6] = (RTCHitN)auVar53[6];
    local_108[7] = (RTCHitN)auVar53[7];
    local_108[8] = (RTCHitN)auVar53[8];
    local_108[9] = (RTCHitN)auVar53[9];
    local_108[10] = (RTCHitN)auVar53[10];
    local_108[0xb] = (RTCHitN)auVar53[0xb];
    local_108[0xc] = (RTCHitN)auVar53[0xc];
    local_108[0xd] = (RTCHitN)auVar53[0xd];
    local_108[0xe] = (RTCHitN)auVar53[0xe];
    local_108[0xf] = (RTCHitN)auVar53[0xf];
    uStack_e4 = local_e8;
    uStack_e0 = local_e8;
    uStack_dc = local_e8;
    fStack_d4 = local_d8;
    fStack_d0 = local_d8;
    fStack_cc = local_d8;
    local_2b8 = auVar47._0_8_;
    uStack_2b0 = auVar47._8_8_;
    local_b8 = local_2b8;
    uStack_b0 = uStack_2b0;
    local_a8 = auVar70;
    vpcmpeqd_avx2(ZEXT1632(auVar70),ZEXT1632(auVar70));
    uStack_94 = context->user->instID[0];
    local_98 = uStack_94;
    uStack_90 = uStack_94;
    uStack_8c = uStack_94;
    uStack_88 = context->user->instPrimID[0];
    uStack_84 = uStack_88;
    uStack_80 = uStack_88;
    uStack_7c = uStack_88;
    *(float *)(ray + k * 4 + 0x80) = auVar82._0_4_;
    args.valid = (int *)local_378;
    args.geometryUserPtr = pGVar8->userPtr;
    args.context = context->user;
    args.ray = (RTCRayN *)ray;
    args.hit = local_108;
    args.N = 4;
    local_378 = auVar12;
    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar8->occlusionFilterN)(&args);
      auVar242 = ZEXT3264(_DAT_01fb9fe0);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar241 = ZEXT1664(auVar53);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar240 = ZEXT1664(auVar53);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar238 = ZEXT1664(auVar53);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar237 = ZEXT1664(auVar53);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar236 = ZEXT1664(auVar53);
      auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar243 = ZEXT3264(auVar93);
    }
    uVar34 = vptestmd_avx512vl(local_378,local_378);
    if ((uVar34 & 0xf) == 0) {
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar239 = ZEXT3264(auVar93);
      auVar53 = vxorps_avx512vl(auVar83,auVar83);
      auVar244 = ZEXT1664(auVar53);
    }
    else {
      p_Var9 = context->args->filter;
      if (p_Var9 == (RTCFilterFunctionN)0x0) {
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar239 = ZEXT3264(auVar93);
        auVar53 = vxorps_avx512vl(auVar83,auVar83);
        auVar244 = ZEXT1664(auVar53);
      }
      else {
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar239 = ZEXT3264(auVar93);
        auVar53 = vxorps_avx512vl(auVar83,auVar83);
        auVar244 = ZEXT1664(auVar53);
        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
             RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
          (*p_Var9)(&args);
          auVar53 = vxorps_avx512vl(auVar53,auVar53);
          auVar244 = ZEXT1664(auVar53);
          auVar242 = ZEXT3264(_DAT_01fb9fe0);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar241 = ZEXT1664(auVar53);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
          auVar240 = ZEXT1664(auVar53);
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
          auVar239 = ZEXT3264(auVar93);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar238 = ZEXT1664(auVar53);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar237 = ZEXT1664(auVar53);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar236 = ZEXT1664(auVar53);
          auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
          auVar243 = ZEXT3264(auVar93);
        }
      }
      auVar245 = ZEXT464(0x3f800000);
      uVar34 = vptestmd_avx512vl(local_378,local_378);
      uVar34 = uVar34 & 0xf;
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar39 = (bool)((byte)uVar34 & 1);
      bVar40 = (bool)((byte)(uVar34 >> 1) & 1);
      bVar37 = (bool)((byte)(uVar34 >> 2) & 1);
      bVar38 = SUB81(uVar34 >> 3,0);
      *(uint *)(args.ray + 0x80) =
           (uint)bVar39 * auVar53._0_4_ | (uint)!bVar39 * *(int *)(args.ray + 0x80);
      *(uint *)(args.ray + 0x84) =
           (uint)bVar40 * auVar53._4_4_ | (uint)!bVar40 * *(int *)(args.ray + 0x84);
      *(uint *)(args.ray + 0x88) =
           (uint)bVar37 * auVar53._8_4_ | (uint)!bVar37 * *(int *)(args.ray + 0x88);
      *(uint *)(args.ray + 0x8c) =
           (uint)bVar38 * auVar53._12_4_ | (uint)!bVar38 * *(int *)(args.ray + 0x8c);
      bVar28 = 1;
      if ((byte)uVar34 != 0) goto LAB_01a651c2;
    }
    auVar245 = ZEXT464(0x3f800000);
    *(float *)(ray + k * 4 + 0x80) = fVar208;
  }
  bVar28 = 0;
LAB_01a651c2:
  bVar35 = (bool)(bVar35 | bVar28);
  goto LAB_01a6430c;
LAB_01a651ca:
  auVar82 = vinsertps_avx(auVar227,auVar75,0x10);
  goto LAB_01a63e11;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }